

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  ulong uVar69;
  RTCIntersectArguments *pRVar70;
  Geometry *geometry;
  long lVar71;
  long lVar72;
  ulong uVar73;
  Geometry *pGVar74;
  uint uVar75;
  bool bVar76;
  ulong uVar77;
  float fVar78;
  float fVar79;
  float fVar126;
  float fVar128;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar132;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined4 uVar133;
  undefined8 uVar134;
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  vint4 bi_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar155;
  float fVar156;
  float fVar160;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar161;
  float fVar168;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar170;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai_1;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_639;
  int local_634;
  RayQueryContext *local_630;
  ulong local_628;
  ulong local_620;
  ulong local_618;
  Precalculations *local_610;
  uint local_604;
  RTCFilterFunctionNArguments local_600;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  ulong local_598;
  Geometry *local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  Primitive *local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar69 = (ulong)(byte)PVar7;
  lVar25 = uVar69 * 0x25;
  fVar156 = *(float *)(prim + lVar25 + 0x12);
  auVar87 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar145._0_4_ = fVar156 * (ray->dir).field_0.m128[0];
  auVar145._4_4_ = fVar156 * (ray->dir).field_0.m128[1];
  auVar145._8_4_ = fVar156 * (ray->dir).field_0.m128[2];
  auVar145._12_4_ = fVar156 * (ray->dir).field_0.m128[3];
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar162._0_4_ = fVar156 * auVar87._0_4_;
  auVar162._4_4_ = fVar156 * auVar87._4_4_;
  auVar162._8_4_ = fVar156 * auVar87._8_4_;
  auVar162._12_4_ = fVar156 * auVar87._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar69 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar171._4_4_ = auVar145._0_4_;
  auVar171._0_4_ = auVar145._0_4_;
  auVar171._8_4_ = auVar145._0_4_;
  auVar171._12_4_ = auVar145._0_4_;
  auVar89 = vshufps_avx(auVar145,auVar145,0x55);
  auVar90 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar156 = auVar90._0_4_;
  auVar146._0_4_ = fVar156 * auVar81._0_4_;
  fVar140 = auVar90._4_4_;
  auVar146._4_4_ = fVar140 * auVar81._4_4_;
  fVar155 = auVar90._8_4_;
  auVar146._8_4_ = fVar155 * auVar81._8_4_;
  fVar161 = auVar90._12_4_;
  auVar146._12_4_ = fVar161 * auVar81._12_4_;
  auVar141._0_4_ = auVar82._0_4_ * fVar156;
  auVar141._4_4_ = auVar82._4_4_ * fVar140;
  auVar141._8_4_ = auVar82._8_4_ * fVar155;
  auVar141._12_4_ = auVar82._12_4_ * fVar161;
  auVar135._0_4_ = auVar83._0_4_ * fVar156;
  auVar135._4_4_ = auVar83._4_4_ * fVar140;
  auVar135._8_4_ = auVar83._8_4_ * fVar155;
  auVar135._12_4_ = auVar83._12_4_ * fVar161;
  auVar90 = vfmadd231ps_fma(auVar146,auVar89,auVar87);
  auVar27 = vfmadd231ps_fma(auVar141,auVar89,auVar21);
  auVar89 = vfmadd231ps_fma(auVar135,auVar23,auVar89);
  auVar90 = vfmadd231ps_fma(auVar90,auVar171,auVar88);
  auVar27 = vfmadd231ps_fma(auVar27,auVar171,auVar20);
  auVar28 = vfmadd231ps_fma(auVar89,auVar22,auVar171);
  auVar190._4_4_ = auVar162._0_4_;
  auVar190._0_4_ = auVar162._0_4_;
  auVar190._8_4_ = auVar162._0_4_;
  auVar190._12_4_ = auVar162._0_4_;
  auVar89 = vshufps_avx(auVar162,auVar162,0x55);
  auVar80 = vshufps_avx512vl(auVar162,auVar162,0xaa);
  auVar81 = vmulps_avx512vl(auVar80,auVar81);
  auVar82 = vmulps_avx512vl(auVar80,auVar82);
  auVar83 = vmulps_avx512vl(auVar80,auVar83);
  auVar87 = vfmadd231ps_fma(auVar81,auVar89,auVar87);
  auVar81 = vfmadd231ps_fma(auVar82,auVar89,auVar21);
  auVar21 = vfmadd231ps_fma(auVar83,auVar89,auVar23);
  auVar29 = vfmadd231ps_fma(auVar87,auVar190,auVar88);
  auVar135 = vfmadd231ps_fma(auVar81,auVar190,auVar20);
  auVar182._8_4_ = 0x7fffffff;
  auVar182._0_8_ = 0x7fffffff7fffffff;
  auVar182._12_4_ = 0x7fffffff;
  auVar136 = vfmadd231ps_fma(auVar21,auVar190,auVar22);
  auVar88 = vandps_avx(auVar182,auVar90);
  auVar179._8_4_ = 0x219392ef;
  auVar179._0_8_ = 0x219392ef219392ef;
  auVar179._12_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar88,auVar179,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar84._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._12_4_;
  auVar88 = vandps_avx(auVar182,auVar27);
  uVar77 = vcmpps_avx512vl(auVar88,auVar179,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar85._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._12_4_;
  auVar88 = vandps_avx(auVar182,auVar28);
  uVar77 = vcmpps_avx512vl(auVar88,auVar179,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar86._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar28._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar28._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar28._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar28._12_4_;
  auVar87 = vrcp14ps_avx512vl(auVar84);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = &DAT_3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar84,auVar87,auVar180);
  auVar28 = vfmadd132ps_fma(auVar88,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar88 = vfnmadd213ps_fma(auVar85,auVar87,auVar180);
  auVar80 = vfmadd132ps_fma(auVar88,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar86);
  auVar88 = vfnmadd213ps_fma(auVar86,auVar87,auVar180);
  auVar26 = vfmadd132ps_fma(auVar88,auVar87,auVar87);
  fVar156 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar177._4_4_ = fVar156;
  auVar177._0_4_ = fVar156;
  auVar177._8_4_ = fVar156;
  auVar177._12_4_ = fVar156;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar20 = vsubps_avx(auVar87,auVar88);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar87 = vpmovsxwd_avx(auVar81);
  auVar81 = vfmadd213ps_fma(auVar20,auVar177,auVar88);
  auVar88 = vcvtdq2ps_avx(auVar87);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar87 = vpmovsxwd_avx(auVar20);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar88);
  auVar20 = vfmadd213ps_fma(auVar87,auVar177,auVar88);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar88 = vpmovsxwd_avx(auVar21);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar77 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 * 2 + uVar77 + 6);
  auVar87 = vpmovsxwd_avx(auVar82);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar88);
  auVar21 = vfmadd213ps_fma(auVar87,auVar177,auVar88);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar88 = vpmovsxwd_avx(auVar22);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar87 = vpmovsxwd_avx(auVar23);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar88);
  auVar82 = vfmadd213ps_fma(auVar87,auVar177,auVar88);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar88 = vpmovsxwd_avx(auVar83);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar69 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar87 = vpmovsxwd_avx(auVar89);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar88);
  auVar22 = vfmadd213ps_fma(auVar87,auVar177,auVar88);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar69) + 6);
  auVar88 = vpmovsxwd_avx(auVar90);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar87 = vpmovsxwd_avx(auVar27);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar88);
  auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar88);
  auVar88 = vsubps_avx(auVar81,auVar29);
  auVar178._0_4_ = auVar28._0_4_ * auVar88._0_4_;
  auVar178._4_4_ = auVar28._4_4_ * auVar88._4_4_;
  auVar178._8_4_ = auVar28._8_4_ * auVar88._8_4_;
  auVar178._12_4_ = auVar28._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar20,auVar29);
  auVar147._0_4_ = auVar28._0_4_ * auVar88._0_4_;
  auVar147._4_4_ = auVar28._4_4_ * auVar88._4_4_;
  auVar147._8_4_ = auVar28._8_4_ * auVar88._8_4_;
  auVar147._12_4_ = auVar28._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar21,auVar135);
  auVar172._0_4_ = auVar80._0_4_ * auVar88._0_4_;
  auVar172._4_4_ = auVar80._4_4_ * auVar88._4_4_;
  auVar172._8_4_ = auVar80._8_4_ * auVar88._8_4_;
  auVar172._12_4_ = auVar80._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar82,auVar135);
  auVar142._0_4_ = auVar80._0_4_ * auVar88._0_4_;
  auVar142._4_4_ = auVar80._4_4_ * auVar88._4_4_;
  auVar142._8_4_ = auVar80._8_4_ * auVar88._8_4_;
  auVar142._12_4_ = auVar80._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar22,auVar136);
  auVar163._0_4_ = auVar26._0_4_ * auVar88._0_4_;
  auVar163._4_4_ = auVar26._4_4_ * auVar88._4_4_;
  auVar163._8_4_ = auVar26._8_4_ * auVar88._8_4_;
  auVar163._12_4_ = auVar26._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar87,auVar136);
  auVar136._0_4_ = auVar26._0_4_ * auVar88._0_4_;
  auVar136._4_4_ = auVar26._4_4_ * auVar88._4_4_;
  auVar136._8_4_ = auVar26._8_4_ * auVar88._8_4_;
  auVar136._12_4_ = auVar26._12_4_ * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar178,auVar147);
  auVar87 = vpminsd_avx(auVar172,auVar142);
  auVar88 = vmaxps_avx(auVar88,auVar87);
  auVar87 = vpminsd_avx(auVar163,auVar136);
  uVar133 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar28._4_4_ = uVar133;
  auVar28._0_4_ = uVar133;
  auVar28._8_4_ = uVar133;
  auVar28._12_4_ = uVar133;
  auVar87 = vmaxps_avx512vl(auVar87,auVar28);
  auVar88 = vmaxps_avx(auVar88,auVar87);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar88,auVar80);
  auVar88 = vpmaxsd_avx(auVar178,auVar147);
  auVar87 = vpmaxsd_avx(auVar172,auVar142);
  auVar88 = vminps_avx(auVar88,auVar87);
  auVar87 = vpmaxsd_avx(auVar163,auVar136);
  fVar156 = ray->tfar;
  auVar26._4_4_ = fVar156;
  auVar26._0_4_ = fVar156;
  auVar26._8_4_ = fVar156;
  auVar26._12_4_ = fVar156;
  auVar87 = vminps_avx512vl(auVar87,auVar26);
  auVar88 = vminps_avx(auVar88,auVar87);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar29);
  auVar87 = vpbroadcastd_avx512vl();
  uVar134 = vcmpps_avx512vl(local_170,auVar88,2);
  uVar77 = vpcmpgtd_avx512vl(auVar87,_DAT_01ff0cf0);
  uVar77 = ((byte)uVar134 & 0xf) & uVar77;
  local_639 = (char)uVar77 != '\0';
  local_630 = context;
  local_610 = pre;
  local_4e8 = prim;
  if (local_639) {
    do {
      lVar25 = 0;
      for (uVar69 = uVar77; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_618 = (ulong)*(uint *)(local_4e8 + 2);
      local_598 = (ulong)*(uint *)(local_4e8 + lVar25 * 4 + 6);
      pGVar74 = (context->scene->geometries).items[local_618].ptr;
      uVar69 = (ulong)*(uint *)(*(long *)&pGVar74->field_0x58 +
                               local_598 *
                               pGVar74[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar156 = (pGVar74->time_range).lower;
      fVar156 = pGVar74->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar156) / ((pGVar74->time_range).upper - fVar156));
      auVar88 = vroundss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),9);
      auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar74->fnumTimeSegments + -1.0)));
      auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
      fVar156 = fVar156 - auVar88._0_4_;
      _Var9 = pGVar74[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar72 = (long)(int)auVar88._0_4_ * 0x38;
      lVar25 = *(long *)(_Var9 + 0x10 + lVar72);
      lVar71 = *(long *)(_Var9 + 0x38 + lVar72);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar72);
      auVar143._4_4_ = fVar156;
      auVar143._0_4_ = fVar156;
      auVar143._8_4_ = fVar156;
      auVar143._12_4_ = fVar156;
      pfVar3 = (float *)(lVar71 + uVar69 * lVar10);
      auVar183._0_4_ = fVar156 * *pfVar3;
      auVar183._4_4_ = fVar156 * pfVar3[1];
      auVar183._8_4_ = fVar156 * pfVar3[2];
      auVar183._12_4_ = fVar156 * pfVar3[3];
      pfVar3 = (float *)(lVar71 + (uVar69 + 1) * lVar10);
      auVar184._0_4_ = fVar156 * *pfVar3;
      auVar184._4_4_ = fVar156 * pfVar3[1];
      auVar184._8_4_ = fVar156 * pfVar3[2];
      auVar184._12_4_ = fVar156 * pfVar3[3];
      auVar88 = vmulps_avx512vl(auVar143,*(undefined1 (*) [16])(lVar71 + (uVar69 + 2) * lVar10));
      auVar87 = vmulps_avx512vl(auVar143,*(undefined1 (*) [16])(lVar71 + lVar10 * (uVar69 + 3)));
      lVar71 = *(long *)(_Var9 + lVar72);
      fVar156 = 1.0 - fVar156;
      auVar137._4_4_ = fVar156;
      auVar137._0_4_ = fVar156;
      auVar137._8_4_ = fVar156;
      auVar137._12_4_ = fVar156;
      local_570 = vfmadd231ps_fma(auVar183,auVar137,*(undefined1 (*) [16])(lVar71 + lVar25 * uVar69)
                                 );
      local_350 = vfmadd231ps_fma(auVar184,auVar137,
                                  *(undefined1 (*) [16])(lVar71 + lVar25 * (uVar69 + 1)));
      local_360 = vfmadd231ps_avx512vl
                            (auVar88,auVar137,*(undefined1 (*) [16])(lVar71 + lVar25 * (uVar69 + 2))
                            );
      local_370 = vfmadd231ps_avx512vl
                            (auVar87,auVar137,*(undefined1 (*) [16])(lVar71 + lVar25 * (uVar69 + 3))
                            );
      iVar8 = (int)pGVar74[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar25 = (long)iVar8 * 0x44;
      aVar4 = (ray->org).field_0;
      auVar87 = vsubps_avx(local_570,(undefined1  [16])aVar4);
      uVar133 = auVar87._0_4_;
      auVar148._4_4_ = uVar133;
      auVar148._0_4_ = uVar133;
      auVar148._8_4_ = uVar133;
      auVar148._12_4_ = uVar133;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      aVar5 = (local_610->ray_space).vx.field_0;
      aVar6 = (local_610->ray_space).vy.field_0;
      fVar156 = (local_610->ray_space).vz.field_0.m128[0];
      fVar140 = (local_610->ray_space).vz.field_0.m128[1];
      fVar155 = (local_610->ray_space).vz.field_0.m128[2];
      fVar161 = (local_610->ray_space).vz.field_0.m128[3];
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar186._0_4_ = auVar87._0_4_ * fVar156;
      auVar186._4_4_ = auVar87._4_4_ * fVar140;
      auVar186._8_4_ = auVar87._8_4_ * fVar155;
      auVar186._12_4_ = auVar87._12_4_ * fVar161;
      auVar88 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar88);
      auVar81 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar148);
      auVar87 = vsubps_avx(local_350,(undefined1  [16])aVar4);
      uVar133 = auVar87._0_4_;
      auVar149._4_4_ = uVar133;
      auVar149._0_4_ = uVar133;
      auVar149._8_4_ = uVar133;
      auVar149._12_4_ = uVar133;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar187._0_4_ = auVar87._0_4_ * fVar156;
      auVar187._4_4_ = auVar87._4_4_ * fVar140;
      auVar187._8_4_ = auVar87._8_4_ * fVar155;
      auVar187._12_4_ = auVar87._12_4_ * fVar161;
      auVar88 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar6,auVar88);
      auVar20 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar149);
      auVar87 = vsubps_avx512vl(local_360,(undefined1  [16])aVar4);
      uVar133 = auVar87._0_4_;
      auVar150._4_4_ = uVar133;
      auVar150._0_4_ = uVar133;
      auVar150._8_4_ = uVar133;
      auVar150._12_4_ = uVar133;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar188._0_4_ = auVar87._0_4_ * fVar156;
      auVar188._4_4_ = auVar87._4_4_ * fVar140;
      auVar188._8_4_ = auVar87._8_4_ * fVar155;
      auVar188._12_4_ = auVar87._12_4_ * fVar161;
      auVar88 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar88);
      auVar21 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar150);
      auVar87 = vsubps_avx512vl(local_370,(undefined1  [16])aVar4);
      uVar133 = auVar87._0_4_;
      auVar144._4_4_ = uVar133;
      auVar144._0_4_ = uVar133;
      auVar144._8_4_ = uVar133;
      auVar144._12_4_ = uVar133;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar192._0_4_ = auVar87._0_4_ * fVar156;
      auVar192._4_4_ = auVar87._4_4_ * fVar140;
      auVar192._8_4_ = auVar87._8_4_ * fVar155;
      auVar192._12_4_ = auVar87._12_4_ * fVar161;
      auVar88 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar6,auVar88);
      auVar82 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar144);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar133 = auVar81._0_4_;
      local_3a0._4_4_ = uVar133;
      local_3a0._0_4_ = uVar133;
      local_3a0._8_4_ = uVar133;
      local_3a0._12_4_ = uVar133;
      local_3a0._16_4_ = uVar133;
      local_3a0._20_4_ = uVar133;
      local_3a0._24_4_ = uVar133;
      local_3a0._28_4_ = uVar133;
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar91._8_4_ = 1;
      auVar91._0_8_ = 0x100000001;
      auVar91._12_4_ = 1;
      auVar91._16_4_ = 1;
      auVar91._20_4_ = 1;
      auVar91._24_4_ = 1;
      auVar91._28_4_ = 1;
      local_340 = vpermps_avx2(auVar91,ZEXT1632(auVar81));
      local_3c0 = vbroadcastss_avx512vl(auVar20);
      local_540 = vpermps_avx512vl(auVar91,ZEXT1632(auVar20));
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_560 = vbroadcastss_avx512vl(auVar21);
      local_440 = vpermps_avx512vl(auVar91,ZEXT1632(auVar21));
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_460 = vbroadcastss_avx512vl(auVar82);
      auVar202 = ZEXT3264(local_460);
      local_480 = vpermps_avx512vl(auVar91,ZEXT1632(auVar82));
      auVar203 = ZEXT3264(local_480);
      auVar91 = vmulps_avx512vl(local_460,auVar103);
      auVar92 = vmulps_avx512vl(local_480,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_560);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar104,local_440);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_3c0);
      auVar93 = vfmadd231ps_avx512vl(auVar92,auVar108,local_540);
      auVar94 = vfmadd231ps_avx512vl(auVar91,auVar106,local_3a0);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar95 = vfmadd231ps_avx512vl(auVar93,auVar106,local_340);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar96 = vmulps_avx512vl(local_460,auVar93);
      auVar97 = vmulps_avx512vl(local_480,auVar93);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_560);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_440);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_3c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_540);
      auVar22 = vfmadd231ps_fma(auVar96,auVar91,local_3a0);
      auVar23 = vfmadd231ps_fma(auVar97,auVar91,local_340);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar22),auVar94);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar23),auVar95);
      auVar96 = vmulps_avx512vl(auVar95,auVar97);
      auVar99 = vmulps_avx512vl(auVar94,auVar98);
      auVar96 = vsubps_avx512vl(auVar96,auVar99);
      auVar88 = vshufps_avx(local_570,local_570,0xff);
      uVar134 = auVar88._0_8_;
      local_80._8_8_ = uVar134;
      local_80._0_8_ = uVar134;
      local_80._16_8_ = uVar134;
      local_80._24_8_ = uVar134;
      auVar88 = vshufps_avx(local_350,local_350,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(local_360,local_360,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(local_370,local_370,0xff);
      uVar134 = auVar88._0_8_;
      register0x00001248 = uVar134;
      local_e0 = uVar134;
      register0x00001250 = uVar134;
      register0x00001258 = uVar134;
      auVar99 = vmulps_avx512vl(_local_e0,auVar103);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_80);
      auVar100 = vmulps_avx512vl(_local_e0,auVar93);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_a0);
      auVar83 = vfmadd231ps_fma(auVar100,auVar91,local_80);
      auVar100 = vmulps_avx512vl(auVar98,auVar98);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar97);
      auVar101 = vmaxps_avx512vl(auVar99,ZEXT1632(auVar83));
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      auVar100 = vmulps_avx512vl(auVar101,auVar100);
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      uVar134 = vcmpps_avx512vl(auVar96,auVar100,2);
      auVar88 = vblendps_avx(auVar81,local_570,8);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar87 = vandps_avx512vl(auVar88,auVar89);
      auVar88 = vblendps_avx(auVar20,local_350,8);
      auVar88 = vandps_avx512vl(auVar88,auVar89);
      auVar87 = vmaxps_avx(auVar87,auVar88);
      auVar88 = vblendps_avx(auVar21,local_360,8);
      auVar90 = vandps_avx512vl(auVar88,auVar89);
      auVar88 = vblendps_avx(auVar82,local_370,8);
      auVar88 = vandps_avx512vl(auVar88,auVar89);
      auVar88 = vmaxps_avx(auVar90,auVar88);
      auVar88 = vmaxps_avx(auVar87,auVar88);
      auVar87 = vmovshdup_avx(auVar88);
      auVar87 = vmaxss_avx(auVar87,auVar88);
      auVar88 = vshufpd_avx(auVar88,auVar88,1);
      auVar88 = vmaxss_avx(auVar88,auVar87);
      _local_300 = vcvtsi2ss_avx512f(local_360,iVar8);
      auVar100._0_4_ = local_300._0_4_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar100._16_4_ = auVar100._0_4_;
      auVar100._20_4_ = auVar100._0_4_;
      auVar100._24_4_ = auVar100._0_4_;
      auVar100._28_4_ = auVar100._0_4_;
      uVar24 = vcmpps_avx512vl(auVar100,_DAT_02020f40,0xe);
      local_230 = (byte)uVar134 & (byte)uVar24;
      fVar140 = auVar88._0_4_ * 4.7683716e-07;
      auVar96._8_4_ = 2;
      auVar96._0_8_ = 0x200000002;
      auVar96._12_4_ = 2;
      auVar96._16_4_ = 2;
      auVar96._20_4_ = 2;
      auVar96._24_4_ = 2;
      auVar96._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar96,ZEXT1632(auVar81));
      local_120 = vpermps_avx512vl(auVar96,ZEXT1632(auVar20));
      local_140 = vpermps_avx512vl(auVar96,ZEXT1632(auVar21));
      auVar96 = vpermps_avx2(auVar96,ZEXT1632(auVar82));
      fVar156 = *(float *)((long)&(ray->org).field_0 + 0xc);
      auVar87 = auVar98._0_16_;
      auVar88 = ZEXT416((uint)fVar140);
      context = local_630;
      if (local_230 == 0) {
        bVar76 = false;
        auVar88 = vxorps_avx512vl(auVar87,auVar87);
        auVar200 = ZEXT1664(auVar88);
        auVar197 = ZEXT3264(local_3a0);
        auVar198 = ZEXT3264(local_340);
        auVar199 = ZEXT3264(local_3c0);
        auVar196 = ZEXT3264(local_540);
        auVar204 = ZEXT3264(local_560);
        auVar201 = ZEXT3264(local_440);
      }
      else {
        fStack_49c = 0.0;
        fStack_498 = 0.0;
        fStack_494 = 0.0;
        auVar93 = vmulps_avx512vl(auVar96,auVar93);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar102);
        auVar101 = vfmadd213ps_avx512vl(auVar91,local_100,auVar92);
        auVar103 = vmulps_avx512vl(auVar96,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
        auVar92 = vfmadd213ps_avx512vl(auVar108,local_120,auVar104);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar106,local_100,auVar92);
        auVar106 = vmulps_avx512vl(local_460,auVar91);
        auVar92 = vmulps_avx512vl(local_480,auVar91);
        auVar189._0_4_ = auVar96._0_4_ * auVar91._0_4_;
        auVar189._4_4_ = auVar96._4_4_ * auVar91._4_4_;
        auVar189._8_4_ = auVar96._8_4_ * auVar91._8_4_;
        auVar189._12_4_ = auVar96._12_4_ * auVar91._12_4_;
        auVar189._16_4_ = auVar96._16_4_ * auVar91._16_4_;
        auVar189._20_4_ = auVar96._20_4_ * auVar91._20_4_;
        auVar189._24_4_ = auVar96._24_4_ * auVar91._24_4_;
        auVar189._28_4_ = 0;
        auVar204 = ZEXT3264(local_560);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_560);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar103,local_440);
        auVar103 = vfmadd231ps_avx512vl(auVar189,local_140,auVar103);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_3c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_540);
        auVar92 = vfmadd231ps_avx512vl(auVar103,local_120,auVar104);
        auVar102 = vfmadd231ps_avx512vl(auVar106,auVar108,local_3a0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_340);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar92 = vfmadd231ps_avx512vl(auVar92,local_100,auVar108);
        auVar93 = vmulps_avx512vl(local_460,auVar103);
        auVar107 = vmulps_avx512vl(local_480,auVar103);
        auVar108._4_4_ = auVar96._4_4_ * auVar103._4_4_;
        auVar108._0_4_ = auVar96._0_4_ * auVar103._0_4_;
        auVar108._8_4_ = auVar96._8_4_ * auVar103._8_4_;
        auVar108._12_4_ = auVar96._12_4_ * auVar103._12_4_;
        auVar108._16_4_ = auVar96._16_4_ * auVar103._16_4_;
        auVar108._20_4_ = auVar96._20_4_ * auVar103._20_4_;
        auVar108._24_4_ = auVar96._24_4_ * auVar103._24_4_;
        auVar108._28_4_ = auVar103._28_4_;
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar104,local_560);
        auVar93 = vfmadd231ps_avx512vl(auVar107,auVar104,local_440);
        auVar104 = vfmadd231ps_avx512vl(auVar108,local_140,auVar104);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_3c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_540);
        auVar108 = vfmadd231ps_avx512vl(auVar104,local_120,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar103,auVar106,local_3a0);
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar106,local_340);
        auVar93 = vfmadd231ps_avx512vl(auVar108,local_100,auVar106);
        auVar193._8_4_ = 0x7fffffff;
        auVar193._0_8_ = 0x7fffffff7fffffff;
        auVar193._12_4_ = 0x7fffffff;
        auVar193._16_4_ = 0x7fffffff;
        auVar193._20_4_ = 0x7fffffff;
        auVar193._24_4_ = 0x7fffffff;
        auVar193._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar102,auVar193);
        auVar108 = vandps_avx(auVar91,auVar193);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar106 = vandps_avx(auVar92,auVar193);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        auVar92 = vbroadcastss_avx512vl(auVar88);
        uVar69 = vcmpps_avx512vl(auVar106,auVar92,1);
        bVar76 = (bool)((byte)uVar69 & 1);
        auVar107._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar102._0_4_);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar102._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar102._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar102._12_4_);
        bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar102._16_4_);
        bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar102._20_4_);
        bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar102._24_4_);
        bVar76 = SUB81(uVar69 >> 7,0);
        auVar107._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar102._28_4_;
        bVar76 = (bool)((byte)uVar69 & 1);
        auVar109._0_4_ = (float)((uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar91._0_4_);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar91._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar91._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar91._12_4_);
        bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar91._16_4_);
        bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar91._20_4_);
        bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar91._24_4_);
        bVar76 = SUB81(uVar69 >> 7,0);
        auVar109._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar91._28_4_;
        auVar106 = vandps_avx(auVar193,auVar104);
        auVar108 = vandps_avx(auVar103,auVar193);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar106 = vandps_avx(auVar93,auVar193);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        uVar69 = vcmpps_avx512vl(auVar106,auVar92,1);
        bVar76 = (bool)((byte)uVar69 & 1);
        auVar110._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar104._0_4_);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar104._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar104._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar104._12_4_);
        bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar104._16_4_);
        bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar104._20_4_);
        bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar104._24_4_);
        bVar76 = SUB81(uVar69 >> 7,0);
        auVar110._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar104._28_4_;
        bVar76 = (bool)((byte)uVar69 & 1);
        auVar111._0_4_ = (float)((uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar103._0_4_);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar103._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar103._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar103._12_4_);
        bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar103._16_4_);
        bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar103._20_4_);
        bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar103._24_4_);
        bVar76 = SUB81(uVar69 >> 7,0);
        auVar111._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar103._28_4_;
        auVar80 = vxorps_avx512vl(auVar87,auVar87);
        auVar200 = ZEXT1664(auVar80);
        auVar106 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar80));
        auVar87 = vfmadd231ps_fma(auVar106,auVar109,auVar109);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar155 = auVar108._0_4_;
        fVar161 = auVar108._4_4_;
        fVar168 = auVar108._8_4_;
        fVar169 = auVar108._12_4_;
        fVar170 = auVar108._16_4_;
        fVar160 = auVar108._20_4_;
        fVar78 = auVar108._24_4_;
        auVar106._4_4_ = fVar161 * fVar161 * fVar161 * auVar87._4_4_ * -0.5;
        auVar106._0_4_ = fVar155 * fVar155 * fVar155 * auVar87._0_4_ * -0.5;
        auVar106._8_4_ = fVar168 * fVar168 * fVar168 * auVar87._8_4_ * -0.5;
        auVar106._12_4_ = fVar169 * fVar169 * fVar169 * auVar87._12_4_ * -0.5;
        auVar106._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar106._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar106._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
        auVar106._28_4_ = auVar93._28_4_;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar91,auVar108);
        auVar104._4_4_ = auVar109._4_4_ * auVar106._4_4_;
        auVar104._0_4_ = auVar109._0_4_ * auVar106._0_4_;
        auVar104._8_4_ = auVar109._8_4_ * auVar106._8_4_;
        auVar104._12_4_ = auVar109._12_4_ * auVar106._12_4_;
        auVar104._16_4_ = auVar109._16_4_ * auVar106._16_4_;
        auVar104._20_4_ = auVar109._20_4_ * auVar106._20_4_;
        auVar104._24_4_ = auVar109._24_4_ * auVar106._24_4_;
        auVar104._28_4_ = 0;
        auVar103._4_4_ = auVar106._4_4_ * -auVar107._4_4_;
        auVar103._0_4_ = auVar106._0_4_ * -auVar107._0_4_;
        auVar103._8_4_ = auVar106._8_4_ * -auVar107._8_4_;
        auVar103._12_4_ = auVar106._12_4_ * -auVar107._12_4_;
        auVar103._16_4_ = auVar106._16_4_ * -auVar107._16_4_;
        auVar103._20_4_ = auVar106._20_4_ * -auVar107._20_4_;
        auVar103._24_4_ = auVar106._24_4_ * -auVar107._24_4_;
        auVar103._28_4_ = auVar109._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar80));
        auVar97 = ZEXT1632(auVar80);
        auVar108 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar97);
        auVar87 = vfmadd231ps_fma(auVar108,auVar111,auVar111);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar155 = auVar108._0_4_;
        fVar161 = auVar108._4_4_;
        fVar168 = auVar108._8_4_;
        fVar169 = auVar108._12_4_;
        fVar170 = auVar108._16_4_;
        fVar160 = auVar108._20_4_;
        fVar78 = auVar108._24_4_;
        auVar92._4_4_ = fVar161 * fVar161 * fVar161 * auVar87._4_4_ * -0.5;
        auVar92._0_4_ = fVar155 * fVar155 * fVar155 * auVar87._0_4_ * -0.5;
        auVar92._8_4_ = fVar168 * fVar168 * fVar168 * auVar87._8_4_ * -0.5;
        auVar92._12_4_ = fVar169 * fVar169 * fVar169 * auVar87._12_4_ * -0.5;
        auVar92._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar92._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar92._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
        auVar92._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar108);
        auVar102._4_4_ = auVar111._4_4_ * auVar91._4_4_;
        auVar102._0_4_ = auVar111._0_4_ * auVar91._0_4_;
        auVar102._8_4_ = auVar111._8_4_ * auVar91._8_4_;
        auVar102._12_4_ = auVar111._12_4_ * auVar91._12_4_;
        auVar102._16_4_ = auVar111._16_4_ * auVar91._16_4_;
        auVar102._20_4_ = auVar111._20_4_ * auVar91._20_4_;
        auVar102._24_4_ = auVar111._24_4_ * auVar91._24_4_;
        auVar102._28_4_ = auVar108._28_4_;
        auVar93._4_4_ = -auVar110._4_4_ * auVar91._4_4_;
        auVar93._0_4_ = -auVar110._0_4_ * auVar91._0_4_;
        auVar93._8_4_ = -auVar110._8_4_ * auVar91._8_4_;
        auVar93._12_4_ = -auVar110._12_4_ * auVar91._12_4_;
        auVar93._16_4_ = -auVar110._16_4_ * auVar91._16_4_;
        auVar93._20_4_ = -auVar110._20_4_ * auVar91._20_4_;
        auVar93._24_4_ = -auVar110._24_4_ * auVar91._24_4_;
        auVar93._28_4_ = auVar110._28_4_ ^ 0x80000000;
        auVar108 = vmulps_avx512vl(auVar91,auVar97);
        auVar87 = vfmadd213ps_fma(auVar104,auVar99,auVar94);
        auVar81 = vfmadd213ps_fma(auVar103,auVar99,auVar95);
        auVar91 = vfmadd213ps_avx512vl(auVar106,auVar99,auVar105);
        auVar92 = vfmadd213ps_avx512vl(auVar102,ZEXT1632(auVar83),ZEXT1632(auVar22));
        auVar89 = vfnmadd213ps_fma(auVar104,auVar99,auVar94);
        auVar94 = ZEXT1632(auVar83);
        auVar20 = vfmadd213ps_fma(auVar93,auVar94,ZEXT1632(auVar23));
        auVar90 = vfnmadd213ps_fma(auVar103,auVar99,auVar95);
        auVar21 = vfmadd213ps_fma(auVar108,auVar94,auVar101);
        auVar104 = vfnmadd231ps_avx512vl(auVar105,auVar99,auVar106);
        auVar27 = vfnmadd213ps_fma(auVar102,auVar94,ZEXT1632(auVar22));
        auVar23 = vfnmadd213ps_fma(auVar93,auVar94,ZEXT1632(auVar23));
        auVar28 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar83),auVar108);
        auVar108 = vsubps_avx512vl(auVar92,ZEXT1632(auVar89));
        auVar106 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar90));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar21),auVar104);
        auVar102 = vmulps_avx512vl(auVar106,auVar104);
        auVar82 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar90),auVar103);
        auVar94._4_4_ = auVar89._4_4_ * auVar103._4_4_;
        auVar94._0_4_ = auVar89._0_4_ * auVar103._0_4_;
        auVar94._8_4_ = auVar89._8_4_ * auVar103._8_4_;
        auVar94._12_4_ = auVar89._12_4_ * auVar103._12_4_;
        auVar94._16_4_ = auVar103._16_4_ * 0.0;
        auVar94._20_4_ = auVar103._20_4_ * 0.0;
        auVar94._24_4_ = auVar103._24_4_ * 0.0;
        auVar94._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar94,auVar104,auVar108);
        auVar95._4_4_ = auVar90._4_4_ * auVar108._4_4_;
        auVar95._0_4_ = auVar90._0_4_ * auVar108._0_4_;
        auVar95._8_4_ = auVar90._8_4_ * auVar108._8_4_;
        auVar95._12_4_ = auVar90._12_4_ * auVar108._12_4_;
        auVar95._16_4_ = auVar108._16_4_ * 0.0;
        auVar95._20_4_ = auVar108._20_4_ * 0.0;
        auVar95._24_4_ = auVar108._24_4_ * 0.0;
        auVar95._28_4_ = auVar108._28_4_;
        auVar22 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar89),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar97,auVar103);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,ZEXT1632(auVar82));
        auVar107 = ZEXT1632(auVar80);
        uVar69 = vcmpps_avx512vl(auVar106,auVar107,2);
        bVar12 = (byte)uVar69;
        fVar78 = (float)((uint)(bVar12 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar12 & 1) * auVar27._0_4_);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar126 = (float)((uint)bVar76 * auVar87._4_4_ | (uint)!bVar76 * auVar27._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar128 = (float)((uint)bVar76 * auVar87._8_4_ | (uint)!bVar76 * auVar27._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar130 = (float)((uint)bVar76 * auVar87._12_4_ | (uint)!bVar76 * auVar27._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar78))));
        fVar79 = (float)((uint)(bVar12 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar12 & 1) * auVar23._0_4_);
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar127 = (float)((uint)bVar76 * auVar81._4_4_ | (uint)!bVar76 * auVar23._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar129 = (float)((uint)bVar76 * auVar81._8_4_ | (uint)!bVar76 * auVar23._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar131 = (float)((uint)bVar76 * auVar81._12_4_ | (uint)!bVar76 * auVar23._12_4_);
        auVar93 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar79))));
        auVar105._0_4_ =
             (float)((uint)(bVar12 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar28._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar28._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar28._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar28._12_4_);
        fVar155 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_);
        auVar105._16_4_ = fVar155;
        fVar161 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_);
        auVar105._20_4_ = fVar161;
        fVar168 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_);
        auVar105._24_4_ = fVar168;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
        auVar105._28_4_ = iVar1;
        auVar108 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar92);
        auVar112._0_4_ =
             (uint)(bVar12 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar82._0_4_;
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar82._4_4_;
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar82._8_4_;
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar82._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar108._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar108._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar108._24_4_;
        auVar112._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar108._28_4_;
        auVar108 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar20));
        auVar113._0_4_ =
             (float)((uint)(bVar12 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar81._0_4_
                    );
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar81._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar81._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar81._12_4_);
        fVar169 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar108._16_4_);
        auVar113._16_4_ = fVar169;
        fVar170 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar108._20_4_);
        auVar113._20_4_ = fVar170;
        fVar160 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar108._24_4_);
        auVar113._24_4_ = fVar160;
        auVar113._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar108._28_4_;
        auVar108 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar21));
        auVar114._0_4_ =
             (float)((uint)(bVar12 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar91._0_4_
                    );
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar91._4_4_);
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar91._8_4_);
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar91._12_4_);
        bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar76 * auVar108._16_4_ | (uint)!bVar76 * auVar91._16_4_);
        bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar76 * auVar108._20_4_ | (uint)!bVar76 * auVar91._20_4_);
        bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar76 * auVar108._24_4_ | (uint)!bVar76 * auVar91._24_4_);
        bVar76 = SUB81(uVar69 >> 7,0);
        auVar114._28_4_ = (uint)bVar76 * auVar108._28_4_ | (uint)!bVar76 * auVar91._28_4_;
        auVar115._0_4_ =
             (uint)(bVar12 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar92._0_4_;
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar76 * (int)auVar89._4_4_ | (uint)!bVar76 * auVar92._4_4_;
        bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar76 * (int)auVar89._8_4_ | (uint)!bVar76 * auVar92._8_4_;
        bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar76 * (int)auVar89._12_4_ | (uint)!bVar76 * auVar92._12_4_;
        auVar115._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_;
        auVar115._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_;
        auVar115._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_;
        auVar115._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar92._28_4_;
        bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar116._0_4_ =
             (uint)(bVar12 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar21._0_4_;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar21._4_4_;
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar21._8_4_;
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar21._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
        auVar116._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar115,auVar102);
        auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar90._12_4_ |
                                                 (uint)!bVar15 * auVar20._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar90._8_4_ |
                                                          (uint)!bVar14 * auVar20._8_4_,
                                                          CONCAT44((uint)bVar76 * (int)auVar90._4_4_
                                                                   | (uint)!bVar76 * auVar20._4_4_,
                                                                   (uint)(bVar12 & 1) *
                                                                   (int)auVar90._0_4_ |
                                                                   (uint)!(bool)(bVar12 & 1) *
                                                                   auVar20._0_4_)))),auVar93);
        auVar104 = vsubps_avx(auVar116,auVar105);
        auVar103 = vsubps_avx(auVar102,auVar112);
        auVar91 = vsubps_avx(auVar93,auVar113);
        auVar92 = vsubps_avx(auVar105,auVar114);
        auVar97._4_4_ = auVar104._4_4_ * fVar126;
        auVar97._0_4_ = auVar104._0_4_ * fVar78;
        auVar97._8_4_ = auVar104._8_4_ * fVar128;
        auVar97._12_4_ = auVar104._12_4_ * fVar130;
        auVar97._16_4_ = auVar104._16_4_ * 0.0;
        auVar97._20_4_ = auVar104._20_4_ * 0.0;
        auVar97._24_4_ = auVar104._24_4_ * 0.0;
        auVar97._28_4_ = iVar2;
        auVar87 = vfmsub231ps_fma(auVar97,auVar105,auVar94);
        auVar98._4_4_ = fVar127 * auVar94._4_4_;
        auVar98._0_4_ = fVar79 * auVar94._0_4_;
        auVar98._8_4_ = fVar129 * auVar94._8_4_;
        auVar98._12_4_ = fVar131 * auVar94._12_4_;
        auVar98._16_4_ = auVar94._16_4_ * 0.0;
        auVar98._20_4_ = auVar94._20_4_ * 0.0;
        auVar98._24_4_ = auVar94._24_4_ * 0.0;
        auVar98._28_4_ = auVar106._28_4_;
        auVar81 = vfmsub231ps_fma(auVar98,auVar102,auVar108);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar107,ZEXT1632(auVar87));
        auVar164._0_4_ = auVar108._0_4_ * auVar105._0_4_;
        auVar164._4_4_ = auVar108._4_4_ * auVar105._4_4_;
        auVar164._8_4_ = auVar108._8_4_ * auVar105._8_4_;
        auVar164._12_4_ = auVar108._12_4_ * auVar105._12_4_;
        auVar164._16_4_ = auVar108._16_4_ * fVar155;
        auVar164._20_4_ = auVar108._20_4_ * fVar161;
        auVar164._24_4_ = auVar108._24_4_ * fVar168;
        auVar164._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar164,auVar93,auVar104);
        auVar95 = vfmadd231ps_avx512vl(auVar106,auVar107,ZEXT1632(auVar87));
        auVar106 = vmulps_avx512vl(auVar92,auVar112);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar114);
        auVar101._4_4_ = auVar91._4_4_ * auVar114._4_4_;
        auVar101._0_4_ = auVar91._0_4_ * auVar114._0_4_;
        auVar101._8_4_ = auVar91._8_4_ * auVar114._8_4_;
        auVar101._12_4_ = auVar91._12_4_ * auVar114._12_4_;
        auVar101._16_4_ = auVar91._16_4_ * auVar114._16_4_;
        auVar101._20_4_ = auVar91._20_4_ * auVar114._20_4_;
        auVar101._24_4_ = auVar91._24_4_ * auVar114._24_4_;
        auVar101._28_4_ = auVar114._28_4_;
        auVar87 = vfmsub231ps_fma(auVar101,auVar113,auVar92);
        auVar165._0_4_ = auVar113._0_4_ * auVar103._0_4_;
        auVar165._4_4_ = auVar113._4_4_ * auVar103._4_4_;
        auVar165._8_4_ = auVar113._8_4_ * auVar103._8_4_;
        auVar165._12_4_ = auVar113._12_4_ * auVar103._12_4_;
        auVar165._16_4_ = fVar169 * auVar103._16_4_;
        auVar165._20_4_ = fVar170 * auVar103._20_4_;
        auVar165._24_4_ = fVar160 * auVar103._24_4_;
        auVar165._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar165,auVar91,auVar112);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar107,auVar106);
        auVar97 = vfmadd231ps_avx512vl(auVar106,auVar107,ZEXT1632(auVar87));
        auVar106 = vmaxps_avx(auVar95,auVar97);
        uVar134 = vcmpps_avx512vl(auVar106,auVar107,2);
        local_230 = local_230 & (byte)uVar134;
        auVar197 = ZEXT3264(local_3a0);
        auVar198 = ZEXT3264(local_340);
        auVar199 = ZEXT3264(local_3c0);
        auVar196 = ZEXT3264(local_540);
        auVar191 = ZEXT1664(auVar88);
        if (local_230 == 0) {
          local_230 = 0;
        }
        else {
          auVar38._4_4_ = auVar92._4_4_ * auVar108._4_4_;
          auVar38._0_4_ = auVar92._0_4_ * auVar108._0_4_;
          auVar38._8_4_ = auVar92._8_4_ * auVar108._8_4_;
          auVar38._12_4_ = auVar92._12_4_ * auVar108._12_4_;
          auVar38._16_4_ = auVar92._16_4_ * auVar108._16_4_;
          auVar38._20_4_ = auVar92._20_4_ * auVar108._20_4_;
          auVar38._24_4_ = auVar92._24_4_ * auVar108._24_4_;
          auVar38._28_4_ = auVar106._28_4_;
          auVar20 = vfmsub231ps_fma(auVar38,auVar91,auVar104);
          auVar39._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar39._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar39._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar39._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar39._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar39._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar39._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar39._28_4_ = auVar104._28_4_;
          auVar81 = vfmsub231ps_fma(auVar39,auVar94,auVar92);
          auVar40._4_4_ = auVar91._4_4_ * auVar94._4_4_;
          auVar40._0_4_ = auVar91._0_4_ * auVar94._0_4_;
          auVar40._8_4_ = auVar91._8_4_ * auVar94._8_4_;
          auVar40._12_4_ = auVar91._12_4_ * auVar94._12_4_;
          auVar40._16_4_ = auVar91._16_4_ * auVar94._16_4_;
          auVar40._20_4_ = auVar91._20_4_ * auVar94._20_4_;
          auVar40._24_4_ = auVar91._24_4_ * auVar94._24_4_;
          auVar40._28_4_ = auVar91._28_4_;
          auVar21 = vfmsub231ps_fma(auVar40,auVar103,auVar108);
          auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar21));
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar20),auVar107);
          auVar108 = vrcp14ps_avx512vl(auVar106);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = &DAT_3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar104 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar31);
          auVar87 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
          auVar41._4_4_ = auVar21._4_4_ * auVar105._4_4_;
          auVar41._0_4_ = auVar21._0_4_ * auVar105._0_4_;
          auVar41._8_4_ = auVar21._8_4_ * auVar105._8_4_;
          auVar41._12_4_ = auVar21._12_4_ * auVar105._12_4_;
          auVar41._16_4_ = fVar155 * 0.0;
          auVar41._20_4_ = fVar161 * 0.0;
          auVar41._24_4_ = fVar168 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar81 = vfmadd231ps_fma(auVar41,auVar93,ZEXT1632(auVar81));
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,ZEXT1632(auVar20));
          fVar161 = auVar87._0_4_;
          fVar168 = auVar87._4_4_;
          fVar169 = auVar87._8_4_;
          fVar170 = auVar87._12_4_;
          auVar108 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar170,
                                        CONCAT48(auVar81._8_4_ * fVar169,
                                                 CONCAT44(auVar81._4_4_ * fVar168,
                                                          auVar81._0_4_ * fVar161))));
          auVar181._4_4_ = fVar156;
          auVar181._0_4_ = fVar156;
          auVar181._8_4_ = fVar156;
          auVar181._12_4_ = fVar156;
          auVar181._16_4_ = fVar156;
          auVar181._20_4_ = fVar156;
          auVar181._24_4_ = fVar156;
          auVar181._28_4_ = fVar156;
          uVar134 = vcmpps_avx512vl(auVar181,auVar108,2);
          fVar155 = ray->tfar;
          auVar32._4_4_ = fVar155;
          auVar32._0_4_ = fVar155;
          auVar32._8_4_ = fVar155;
          auVar32._12_4_ = fVar155;
          auVar32._16_4_ = fVar155;
          auVar32._20_4_ = fVar155;
          auVar32._24_4_ = fVar155;
          auVar32._28_4_ = fVar155;
          uVar24 = vcmpps_avx512vl(auVar108,auVar32,2);
          local_230 = (byte)uVar134 & (byte)uVar24 & local_230;
          if (local_230 != 0) {
            uVar134 = vcmpps_avx512vl(auVar106,auVar107,4);
            if ((local_230 & (byte)uVar134) != 0) {
              local_230 = local_230 & (byte)uVar134;
              fVar155 = auVar95._0_4_ * fVar161;
              fVar160 = auVar95._4_4_ * fVar168;
              auVar42._4_4_ = fVar160;
              auVar42._0_4_ = fVar155;
              fVar78 = auVar95._8_4_ * fVar169;
              auVar42._8_4_ = fVar78;
              fVar79 = auVar95._12_4_ * fVar170;
              auVar42._12_4_ = fVar79;
              fVar126 = auVar95._16_4_ * 0.0;
              auVar42._16_4_ = fVar126;
              fVar127 = auVar95._20_4_ * 0.0;
              auVar42._20_4_ = fVar127;
              fVar128 = auVar95._24_4_ * 0.0;
              auVar42._24_4_ = fVar128;
              auVar42._28_4_ = auVar95._28_4_;
              fVar161 = auVar97._0_4_ * fVar161;
              fVar168 = auVar97._4_4_ * fVar168;
              auVar43._4_4_ = fVar168;
              auVar43._0_4_ = fVar161;
              fVar169 = auVar97._8_4_ * fVar169;
              auVar43._8_4_ = fVar169;
              fVar170 = auVar97._12_4_ * fVar170;
              auVar43._12_4_ = fVar170;
              fVar129 = auVar97._16_4_ * 0.0;
              auVar43._16_4_ = fVar129;
              fVar130 = auVar97._20_4_ * 0.0;
              auVar43._20_4_ = fVar130;
              fVar131 = auVar97._24_4_ * 0.0;
              auVar43._24_4_ = fVar131;
              auVar43._28_4_ = auVar97._28_4_;
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = &DAT_3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar175._16_4_ = 0x3f800000;
              auVar175._20_4_ = 0x3f800000;
              auVar175._24_4_ = 0x3f800000;
              auVar175._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar175,auVar42);
              local_3e0._0_4_ =
                   (uint)(bVar12 & 1) * (int)fVar155 | (uint)!(bool)(bVar12 & 1) * auVar106._0_4_;
              bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
              local_3e0._4_4_ = (uint)bVar76 * (int)fVar160 | (uint)!bVar76 * auVar106._4_4_;
              bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
              local_3e0._8_4_ = (uint)bVar76 * (int)fVar78 | (uint)!bVar76 * auVar106._8_4_;
              bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
              local_3e0._12_4_ = (uint)bVar76 * (int)fVar79 | (uint)!bVar76 * auVar106._12_4_;
              bVar76 = (bool)((byte)(uVar69 >> 4) & 1);
              local_3e0._16_4_ = (uint)bVar76 * (int)fVar126 | (uint)!bVar76 * auVar106._16_4_;
              bVar76 = (bool)((byte)(uVar69 >> 5) & 1);
              local_3e0._20_4_ = (uint)bVar76 * (int)fVar127 | (uint)!bVar76 * auVar106._20_4_;
              bVar76 = (bool)((byte)(uVar69 >> 6) & 1);
              local_3e0._24_4_ = (uint)bVar76 * (int)fVar128 | (uint)!bVar76 * auVar106._24_4_;
              bVar76 = SUB81(uVar69 >> 7,0);
              local_3e0._28_4_ = (uint)bVar76 * auVar95._28_4_ | (uint)!bVar76 * auVar106._28_4_;
              auVar106 = vsubps_avx(auVar175,auVar43);
              bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
              bVar18 = SUB81(uVar69 >> 7,0);
              local_1a0._4_4_ = (uint)bVar76 * (int)fVar168 | (uint)!bVar76 * auVar106._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar12 & 1) * (int)fVar161 | (uint)!(bool)(bVar12 & 1) * auVar106._0_4_;
              local_1a0._8_4_ = (uint)bVar13 * (int)fVar169 | (uint)!bVar13 * auVar106._8_4_;
              local_1a0._12_4_ = (uint)bVar14 * (int)fVar170 | (uint)!bVar14 * auVar106._12_4_;
              local_1a0._16_4_ = (uint)bVar15 * (int)fVar129 | (uint)!bVar15 * auVar106._16_4_;
              local_1a0._20_4_ = (uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar106._20_4_;
              local_1a0._24_4_ = (uint)bVar17 * (int)fVar131 | (uint)!bVar17 * auVar106._24_4_;
              local_1a0._28_4_ = (uint)bVar18 * auVar97._28_4_ | (uint)!bVar18 * auVar106._28_4_;
              local_400 = auVar108;
              goto LAB_01c0d381;
            }
          }
          local_230 = 0;
        }
LAB_01c0d381:
        auVar203 = ZEXT3264(local_480);
        auVar202 = ZEXT3264(local_460);
        auVar201 = ZEXT3264(local_440);
        auVar195 = ZEXT3264(auVar96);
        if (local_230 != 0) {
          auVar106 = vsubps_avx(ZEXT1632(auVar83),auVar99);
          auVar87 = vfmadd213ps_fma(auVar106,local_3e0,auVar99);
          fVar155 = local_610->depth_scale;
          auVar99._4_4_ = fVar155;
          auVar99._0_4_ = fVar155;
          auVar99._8_4_ = fVar155;
          auVar99._12_4_ = fVar155;
          auVar99._16_4_ = fVar155;
          auVar99._20_4_ = fVar155;
          auVar99._24_4_ = fVar155;
          auVar99._28_4_ = fVar155;
          auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                        CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                 CONCAT44(auVar87._4_4_ +
                                                                          auVar87._4_4_,
                                                                          auVar87._0_4_ +
                                                                          auVar87._0_4_)))),auVar99)
          ;
          uVar134 = vcmpps_avx512vl(local_400,auVar106,6);
          local_230 = local_230 & (byte)uVar134;
          if (local_230 != 0) {
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar33._8_4_ = 0x40000000;
            auVar33._0_8_ = 0x4000000040000000;
            auVar33._12_4_ = 0x40000000;
            auVar33._16_4_ = 0x40000000;
            auVar33._20_4_ = 0x40000000;
            auVar33._24_4_ = 0x40000000;
            auVar33._28_4_ = 0x40000000;
            local_2c0 = vfmadd132ps_avx512vl(local_1a0,auVar138,auVar33);
            local_1a0 = local_2c0;
            auVar106 = local_1a0;
            local_280 = 0;
            local_270 = local_570._0_8_;
            uStack_268 = local_570._8_8_;
            local_260 = local_350._0_8_;
            uStack_258 = local_350._8_8_;
            local_250 = local_360._0_8_;
            uStack_248 = local_360._8_8_;
            local_240 = local_370._0_8_;
            uStack_238 = local_370._8_8_;
            if ((pGVar74->mask & ray->mask) != 0) {
              if ((local_630->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar76 = true, pGVar74->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar140 = 1.0 / auVar100._0_4_;
                local_220[0] = fVar140 * (local_3e0._0_4_ + 0.0);
                local_220[1] = fVar140 * (local_3e0._4_4_ + 1.0);
                local_220[2] = fVar140 * (local_3e0._8_4_ + 2.0);
                local_220[3] = fVar140 * (local_3e0._12_4_ + 3.0);
                fStack_210 = fVar140 * (local_3e0._16_4_ + 4.0);
                fStack_20c = fVar140 * (local_3e0._20_4_ + 5.0);
                fStack_208 = fVar140 * (local_3e0._24_4_ + 6.0);
                fStack_204 = local_3e0._28_4_ + 7.0;
                local_1a0._0_8_ = local_2c0._0_8_;
                local_1a0._8_8_ = local_2c0._8_8_;
                local_1a0._16_8_ = local_2c0._16_8_;
                local_1a0._24_8_ = local_2c0._24_8_;
                local_200 = local_1a0._0_8_;
                uStack_1f8 = local_1a0._8_8_;
                uStack_1f0 = local_1a0._16_8_;
                uStack_1e8 = local_1a0._24_8_;
                local_1e0 = local_400;
                local_590 = (Geometry *)local_350._0_8_;
                uStack_588 = local_350._8_8_;
                local_628 = 0;
                uVar73 = (ulong)local_230;
                for (uVar69 = uVar73; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000)
                {
                  local_628 = local_628 + 1;
                }
                local_500 = local_360._0_8_;
                uStack_4f8 = local_360._8_8_;
                local_510 = local_370._0_4_;
                fStack_50c = local_370._4_4_;
                fStack_508 = local_370._8_4_;
                fStack_504 = local_370._12_4_;
                bVar76 = true;
                local_580 = auVar88;
                local_4a0 = fVar156;
                local_420 = auVar96;
                local_2e0 = local_3e0;
                local_2a0 = local_400;
                local_27c = iVar8;
                local_1a0 = auVar106;
                do {
                  auVar81 = auVar200._0_16_;
                  local_5c4 = local_220[local_628];
                  local_5c0 = *(undefined4 *)((long)&local_200 + local_628 * 4);
                  local_620 = CONCAT44(local_620._4_4_,ray->tfar);
                  ray->tfar = *(float *)(local_1e0 + local_628 * 4);
                  local_600.context = context->user;
                  fVar155 = 1.0 - local_5c4;
                  fVar140 = fVar155 * fVar155 * -3.0;
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155)),
                                            ZEXT416((uint)(local_5c4 * fVar155)),ZEXT416(0xc0000000)
                                           );
                  auVar87 = vfmsub132ss_fma(ZEXT416((uint)(local_5c4 * fVar155)),
                                            ZEXT416((uint)(local_5c4 * local_5c4)),
                                            ZEXT416(0x40000000));
                  fVar155 = auVar88._0_4_ * 3.0;
                  fVar161 = auVar87._0_4_ * 3.0;
                  fVar168 = local_5c4 * local_5c4 * 3.0;
                  auVar173._0_4_ = fVar168 * local_510;
                  auVar173._4_4_ = fVar168 * fStack_50c;
                  auVar173._8_4_ = fVar168 * fStack_508;
                  auVar173._12_4_ = fVar168 * fStack_504;
                  auVar151._4_4_ = fVar161;
                  auVar151._0_4_ = fVar161;
                  auVar151._8_4_ = fVar161;
                  auVar151._12_4_ = fVar161;
                  auVar65._8_8_ = uStack_4f8;
                  auVar65._0_8_ = local_500;
                  auVar88 = vfmadd132ps_fma(auVar151,auVar173,auVar65);
                  auVar157._4_4_ = fVar155;
                  auVar157._0_4_ = fVar155;
                  auVar157._8_4_ = fVar155;
                  auVar157._12_4_ = fVar155;
                  auVar63._8_8_ = uStack_588;
                  auVar63._0_8_ = local_590;
                  auVar88 = vfmadd132ps_fma(auVar157,auVar88,auVar63);
                  auVar152._4_4_ = fVar140;
                  auVar152._0_4_ = fVar140;
                  auVar152._8_4_ = fVar140;
                  auVar152._12_4_ = fVar140;
                  auVar88 = vfmadd132ps_fma(auVar152,auVar88,local_570);
                  local_5d0 = vmovlps_avx(auVar88);
                  local_5c8 = vextractps_avx(auVar88,2);
                  local_5bc = (undefined4)local_598;
                  local_5b8 = (undefined4)local_618;
                  local_5b4 = (local_600.context)->instID[0];
                  local_5b0 = (local_600.context)->instPrimID[0];
                  local_634 = -1;
                  local_600.valid = &local_634;
                  local_600.geometryUserPtr = pGVar74->userPtr;
                  local_600.hit = (RTCHitN *)&local_5d0;
                  local_600.N = 1;
                  local_320 = (undefined4)uVar73;
                  uStack_31c = (undefined4)(uVar73 >> 0x20);
                  local_600.ray = (RTCRayN *)ray;
                  if (pGVar74->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c0d716:
                    auVar96 = auVar195._0_32_;
                    auVar88 = auVar200._0_16_;
                    p_Var11 = context->args->filter;
                    fVar140 = auVar191._0_4_;
                    if (p_Var11 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar74->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var11)(&local_600);
                      auVar191 = ZEXT1664(local_580);
                      auVar195 = ZEXT3264(local_420);
                      auVar203 = ZEXT3264(local_480);
                      auVar202 = ZEXT3264(local_460);
                      auVar201 = ZEXT3264(local_440);
                      auVar204 = ZEXT3264(local_560);
                      auVar196 = ZEXT3264(local_540);
                      auVar199 = ZEXT3264(local_3c0);
                      auVar198 = ZEXT3264(local_340);
                      auVar197 = ZEXT3264(local_3a0);
                      auVar88 = vxorps_avx512vl(auVar88,auVar88);
                      auVar200 = ZEXT1664(auVar88);
                      context = local_630;
                      fVar156 = local_4a0;
                    }
                    auVar96 = auVar195._0_32_;
                    uVar73 = CONCAT44(uStack_31c,local_320);
                    fVar140 = auVar191._0_4_;
                    if (*local_600.valid != 0) break;
                  }
                  else {
                    (*pGVar74->occlusionFilterN)(&local_600);
                    uVar73 = CONCAT44(uStack_31c,local_320);
                    auVar191 = ZEXT1664(local_580);
                    auVar195 = ZEXT3264(local_420);
                    auVar203 = ZEXT3264(local_480);
                    auVar202 = ZEXT3264(local_460);
                    auVar201 = ZEXT3264(local_440);
                    auVar204 = ZEXT3264(local_560);
                    auVar196 = ZEXT3264(local_540);
                    auVar199 = ZEXT3264(local_3c0);
                    auVar198 = ZEXT3264(local_340);
                    auVar197 = ZEXT3264(local_3a0);
                    auVar88 = vxorps_avx512vl(auVar81,auVar81);
                    auVar200 = ZEXT1664(auVar88);
                    context = local_630;
                    fVar156 = local_4a0;
                    if (*local_600.valid != 0) goto LAB_01c0d716;
                  }
                  auVar96 = auVar195._0_32_;
                  ray->tfar = (float)local_620;
                  uVar69 = local_628 & 0x3f;
                  local_628 = 0;
                  uVar73 = uVar73 ^ 1L << uVar69;
                  for (uVar69 = uVar73; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000
                      ) {
                    local_628 = local_628 + 1;
                  }
                  bVar76 = uVar73 != 0;
                  fVar140 = auVar191._0_4_;
                } while (bVar76);
              }
              goto LAB_01c0d860;
            }
          }
        }
        bVar76 = false;
      }
LAB_01c0d860:
      local_4a0 = fVar140;
      if (8 < iVar8) {
        auVar106 = vpbroadcastd_avx512vl();
        auVar191 = ZEXT3264(auVar106);
        fStack_2f0 = 1.0 / (float)local_300._0_4_;
        local_300._4_4_ = fStack_2f0;
        local_300._0_4_ = fStack_2f0;
        fStack_2f8 = fStack_2f0;
        fStack_2f4 = fStack_2f0;
        lVar71 = 8;
        fStack_49c = local_4a0;
        fStack_498 = local_4a0;
        fStack_494 = local_4a0;
        fStack_490 = local_4a0;
        fStack_48c = local_4a0;
        fStack_488 = local_4a0;
        fStack_484 = local_4a0;
        local_420 = auVar96;
        local_320 = fVar156;
        uStack_31c = fVar156;
        uStack_318 = fVar156;
        uStack_314 = fVar156;
        uStack_310 = fVar156;
        uStack_30c = fVar156;
        uStack_308 = fVar156;
        uStack_304 = fVar156;
        fStack_2ec = fStack_2f0;
        fStack_2e8 = fStack_2f0;
        fStack_2e4 = fStack_2f0;
        do {
          auVar106 = vpbroadcastd_avx512vl();
          auVar91 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar191._0_32_,auVar91);
          auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 * 4 + lVar25);
          auVar108 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar71 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar71 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar25 + 0x2228070 + lVar71 * 4);
          local_460 = auVar202._0_32_;
          auVar92 = vmulps_avx512vl(local_460,auVar103);
          local_480 = auVar203._0_32_;
          auVar102 = vmulps_avx512vl(local_480,auVar103);
          auVar44._4_4_ = auVar103._4_4_ * (float)local_e0._4_4_;
          auVar44._0_4_ = auVar103._0_4_ * (float)local_e0._0_4_;
          auVar44._8_4_ = auVar103._8_4_ * fStack_d8;
          auVar44._12_4_ = auVar103._12_4_ * fStack_d4;
          auVar44._16_4_ = auVar103._16_4_ * fStack_d0;
          auVar44._20_4_ = auVar103._20_4_ * fStack_cc;
          auVar44._24_4_ = auVar103._24_4_ * fStack_c8;
          auVar44._28_4_ = auVar91._28_4_;
          auVar111 = auVar204._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar92,auVar104,auVar111);
          local_440 = auVar201._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar102,auVar104,local_440);
          auVar102 = vfmadd231ps_avx512vl(auVar44,auVar104,local_c0);
          auVar110 = auVar199._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar110);
          auVar107 = auVar196._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar108,auVar107);
          auVar88 = vfmadd231ps_fma(auVar102,auVar108,local_a0);
          auVar109 = auVar197._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar91,auVar106,auVar109);
          local_340 = auVar198._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar92,auVar106,local_340);
          auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 * 4 + lVar25);
          auVar92 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar71 * 4);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar106,local_80);
          auVar102 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar71 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x222a490 + lVar71 * 4);
          auVar96 = vmulps_avx512vl(local_460,auVar93);
          auVar94 = vmulps_avx512vl(local_480,auVar93);
          auVar45._4_4_ = auVar93._4_4_ * (float)local_e0._4_4_;
          auVar45._0_4_ = auVar93._0_4_ * (float)local_e0._0_4_;
          auVar45._8_4_ = auVar93._8_4_ * fStack_d8;
          auVar45._12_4_ = auVar93._12_4_ * fStack_d4;
          auVar45._16_4_ = auVar93._16_4_ * fStack_d0;
          auVar45._20_4_ = auVar93._20_4_ * fStack_cc;
          auVar45._24_4_ = auVar93._24_4_ * fStack_c8;
          auVar45._28_4_ = uStack_c4;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar111);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_440);
          auVar98 = vfmadd231ps_avx512vl(auVar45,auVar102,local_c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar110);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar107);
          auVar87 = vfmadd231ps_fma(auVar98,auVar92,local_a0);
          auVar98 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar109);
          auVar99 = vfmadd231ps_avx512vl(auVar94,auVar91,local_340);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar91,local_80);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar87));
          auVar96 = vsubps_avx(auVar98,auVar95);
          auVar94 = vsubps_avx(auVar99,auVar97);
          auVar101 = vmulps_avx512vl(auVar97,auVar96);
          auVar105 = vmulps_avx512vl(auVar95,auVar94);
          auVar101 = vsubps_avx512vl(auVar101,auVar105);
          auVar105 = vmulps_avx512vl(auVar94,auVar94);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar96);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar105);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar134 = vcmpps_avx512vl(auVar101,auVar100,2);
          local_230 = (byte)uVar24 & (byte)uVar134;
          if (local_230 == 0) {
            auVar195 = ZEXT3264(auVar107);
            auVar204 = ZEXT3264(auVar111);
          }
          else {
            auVar93 = vmulps_avx512vl(local_420,auVar93);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar93);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar102);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_100,auVar92);
            auVar103 = vmulps_avx512vl(local_420,auVar103);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_120,auVar104);
            auVar92 = vfmadd213ps_avx512vl(auVar106,local_100,auVar108);
            auVar106 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar71 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar71 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar71 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar25 + 0x2229280 + lVar71 * 4);
            auVar102 = vmulps_avx512vl(local_460,auVar103);
            auVar93 = vmulps_avx512vl(local_480,auVar103);
            auVar103 = vmulps_avx512vl(local_420,auVar103);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar111);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_440);
            auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
            auVar103 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar110);
            auVar102 = vfmadd231ps_avx512vl(auVar93,auVar108,auVar107);
            auVar108 = vfmadd231ps_avx512vl(auVar104,local_120,auVar108);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar109);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_340);
            auVar93 = vfmadd231ps_avx512vl(auVar108,local_100,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar71 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar71 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar25 + 0x222b6a0 + lVar71 * 4);
            auVar100 = vmulps_avx512vl(local_460,auVar104);
            auVar101 = vmulps_avx512vl(local_480,auVar104);
            auVar104 = vmulps_avx512vl(local_420,auVar104);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar111);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_440);
            auVar104 = vfmadd231ps_avx512vl(auVar104,local_140,auVar108);
            auVar108 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar71 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar110);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar107);
            auVar108 = vfmadd231ps_avx512vl(auVar104,local_120,auVar108);
            auVar104 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar109);
            auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,local_340);
            auVar108 = vfmadd231ps_avx512vl(auVar108,local_100,auVar106);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar103,auVar101);
            vandps_avx512vl(auVar102,auVar101);
            auVar106 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar93,auVar101);
            auVar106 = vmaxps_avx(auVar106,auVar101);
            auVar67._4_4_ = fStack_49c;
            auVar67._0_4_ = local_4a0;
            auVar67._8_4_ = fStack_498;
            auVar67._12_4_ = fStack_494;
            auVar67._16_4_ = fStack_490;
            auVar67._20_4_ = fStack_48c;
            auVar67._24_4_ = fStack_488;
            auVar67._28_4_ = fStack_484;
            uVar69 = vcmpps_avx512vl(auVar106,auVar67,1);
            bVar13 = (bool)((byte)uVar69 & 1);
            auVar117._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar103._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar103._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar103._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar103._12_4_);
            bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar103._16_4_);
            bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar103._20_4_);
            bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar103._24_4_);
            bVar13 = SUB81(uVar69 >> 7,0);
            auVar117._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar103._28_4_;
            bVar13 = (bool)((byte)uVar69 & 1);
            auVar118._0_4_ = (float)((uint)bVar13 * auVar94._0_4_ | (uint)!bVar13 * auVar102._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar102._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar102._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar102._12_4_);
            bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar13 * auVar94._16_4_ | (uint)!bVar13 * auVar102._16_4_);
            bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar13 * auVar94._20_4_ | (uint)!bVar13 * auVar102._20_4_);
            bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar13 * auVar94._24_4_ | (uint)!bVar13 * auVar102._24_4_);
            bVar13 = SUB81(uVar69 >> 7,0);
            auVar118._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar102._28_4_;
            vandps_avx512vl(auVar104,auVar101);
            vandps_avx512vl(auVar100,auVar101);
            auVar106 = vmaxps_avx(auVar118,auVar118);
            vandps_avx512vl(auVar108,auVar101);
            auVar106 = vmaxps_avx(auVar106,auVar118);
            uVar69 = vcmpps_avx512vl(auVar106,auVar67,1);
            bVar13 = (bool)((byte)uVar69 & 1);
            auVar119._0_4_ = (uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar104._0_4_;
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar104._4_4_;
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar104._8_4_;
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar104._12_4_;
            bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar119._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar104._16_4_;
            bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar119._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar104._20_4_;
            bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar119._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar104._24_4_;
            bVar13 = SUB81(uVar69 >> 7,0);
            auVar119._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar104._28_4_;
            bVar13 = (bool)((byte)uVar69 & 1);
            auVar120._0_4_ = (float)((uint)bVar13 * auVar94._0_4_ | (uint)!bVar13 * auVar100._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar100._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar100._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar100._12_4_);
            bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar13 * auVar94._16_4_ | (uint)!bVar13 * auVar100._16_4_);
            bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar13 * auVar94._20_4_ | (uint)!bVar13 * auVar100._20_4_);
            bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar13 * auVar94._24_4_ | (uint)!bVar13 * auVar100._24_4_);
            bVar13 = SUB81(uVar69 >> 7,0);
            auVar120._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar100._28_4_;
            auVar185._8_4_ = 0x80000000;
            auVar185._0_8_ = 0x8000000080000000;
            auVar185._12_4_ = 0x80000000;
            auVar185._16_4_ = 0x80000000;
            auVar185._20_4_ = 0x80000000;
            auVar185._24_4_ = 0x80000000;
            auVar185._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar119,auVar185);
            auVar100 = auVar200._0_32_;
            auVar108 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar100);
            auVar81 = vfmadd231ps_fma(auVar108,auVar118,auVar118);
            auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
            auVar194._8_4_ = 0xbf000000;
            auVar194._0_8_ = 0xbf000000bf000000;
            auVar194._12_4_ = 0xbf000000;
            auVar194._16_4_ = 0xbf000000;
            auVar194._20_4_ = 0xbf000000;
            auVar194._24_4_ = 0xbf000000;
            auVar194._28_4_ = 0xbf000000;
            fVar156 = auVar108._0_4_;
            fVar140 = auVar108._4_4_;
            fVar155 = auVar108._8_4_;
            fVar161 = auVar108._12_4_;
            fVar168 = auVar108._16_4_;
            fVar169 = auVar108._20_4_;
            fVar170 = auVar108._24_4_;
            auVar46._4_4_ = fVar140 * fVar140 * fVar140 * auVar81._4_4_ * -0.5;
            auVar46._0_4_ = fVar156 * fVar156 * fVar156 * auVar81._0_4_ * -0.5;
            auVar46._8_4_ = fVar155 * fVar155 * fVar155 * auVar81._8_4_ * -0.5;
            auVar46._12_4_ = fVar161 * fVar161 * fVar161 * auVar81._12_4_ * -0.5;
            auVar46._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar46._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar46._24_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar46._28_4_ = auVar118._28_4_;
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar108 = vfmadd231ps_avx512vl(auVar46,auVar104,auVar108);
            auVar47._4_4_ = auVar118._4_4_ * auVar108._4_4_;
            auVar47._0_4_ = auVar118._0_4_ * auVar108._0_4_;
            auVar47._8_4_ = auVar118._8_4_ * auVar108._8_4_;
            auVar47._12_4_ = auVar118._12_4_ * auVar108._12_4_;
            auVar47._16_4_ = auVar118._16_4_ * auVar108._16_4_;
            auVar47._20_4_ = auVar118._20_4_ * auVar108._20_4_;
            auVar47._24_4_ = auVar118._24_4_ * auVar108._24_4_;
            auVar47._28_4_ = 0;
            auVar48._4_4_ = auVar108._4_4_ * -auVar117._4_4_;
            auVar48._0_4_ = auVar108._0_4_ * -auVar117._0_4_;
            auVar48._8_4_ = auVar108._8_4_ * -auVar117._8_4_;
            auVar48._12_4_ = auVar108._12_4_ * -auVar117._12_4_;
            auVar48._16_4_ = auVar108._16_4_ * -auVar117._16_4_;
            auVar48._20_4_ = auVar108._20_4_ * -auVar117._20_4_;
            auVar48._24_4_ = auVar108._24_4_ * -auVar117._24_4_;
            auVar48._28_4_ = auVar118._28_4_;
            auVar103 = vmulps_avx512vl(auVar108,auVar100);
            auVar108 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar100);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,auVar120);
            auVar102 = vrsqrt14ps_avx512vl(auVar108);
            auVar108 = vmulps_avx512vl(auVar108,auVar194);
            fVar156 = auVar102._0_4_;
            fVar140 = auVar102._4_4_;
            fVar155 = auVar102._8_4_;
            fVar161 = auVar102._12_4_;
            fVar168 = auVar102._16_4_;
            fVar169 = auVar102._20_4_;
            fVar170 = auVar102._24_4_;
            auVar49._4_4_ = fVar140 * fVar140 * fVar140 * auVar108._4_4_;
            auVar49._0_4_ = fVar156 * fVar156 * fVar156 * auVar108._0_4_;
            auVar49._8_4_ = fVar155 * fVar155 * fVar155 * auVar108._8_4_;
            auVar49._12_4_ = fVar161 * fVar161 * fVar161 * auVar108._12_4_;
            auVar49._16_4_ = fVar168 * fVar168 * fVar168 * auVar108._16_4_;
            auVar49._20_4_ = fVar169 * fVar169 * fVar169 * auVar108._20_4_;
            auVar49._24_4_ = fVar170 * fVar170 * fVar170 * auVar108._24_4_;
            auVar49._28_4_ = auVar108._28_4_;
            auVar108 = vfmadd231ps_avx512vl(auVar49,auVar104,auVar102);
            auVar50._4_4_ = auVar120._4_4_ * auVar108._4_4_;
            auVar50._0_4_ = auVar120._0_4_ * auVar108._0_4_;
            auVar50._8_4_ = auVar120._8_4_ * auVar108._8_4_;
            auVar50._12_4_ = auVar120._12_4_ * auVar108._12_4_;
            auVar50._16_4_ = auVar120._16_4_ * auVar108._16_4_;
            auVar50._20_4_ = auVar120._20_4_ * auVar108._20_4_;
            auVar50._24_4_ = auVar120._24_4_ * auVar108._24_4_;
            auVar50._28_4_ = auVar102._28_4_;
            auVar51._4_4_ = auVar108._4_4_ * auVar106._4_4_;
            auVar51._0_4_ = auVar108._0_4_ * auVar106._0_4_;
            auVar51._8_4_ = auVar108._8_4_ * auVar106._8_4_;
            auVar51._12_4_ = auVar108._12_4_ * auVar106._12_4_;
            auVar51._16_4_ = auVar108._16_4_ * auVar106._16_4_;
            auVar51._20_4_ = auVar108._20_4_ * auVar106._20_4_;
            auVar51._24_4_ = auVar108._24_4_ * auVar106._24_4_;
            auVar51._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar108,auVar100);
            auVar81 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar88),auVar95);
            auVar108 = ZEXT1632(auVar88);
            auVar20 = vfmadd213ps_fma(auVar48,auVar108,auVar97);
            auVar104 = vfmadd213ps_avx512vl(auVar103,auVar108,auVar92);
            auVar102 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar87),auVar98);
            auVar83 = vfnmadd213ps_fma(auVar47,auVar108,auVar95);
            auVar93 = ZEXT1632(auVar87);
            auVar21 = vfmadd213ps_fma(auVar51,auVar93,auVar99);
            auVar89 = vfnmadd213ps_fma(auVar48,auVar108,auVar97);
            auVar82 = vfmadd213ps_fma(auVar106,auVar93,auVar91);
            auVar97 = ZEXT1632(auVar88);
            auVar28 = vfnmadd231ps_fma(auVar92,auVar97,auVar103);
            auVar90 = vfnmadd213ps_fma(auVar50,auVar93,auVar98);
            auVar27 = vfnmadd213ps_fma(auVar51,auVar93,auVar99);
            auVar80 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar87),auVar106);
            auVar91 = vsubps_avx512vl(auVar102,ZEXT1632(auVar83));
            auVar106 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar89));
            auVar108 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar28));
            auVar52._4_4_ = auVar106._4_4_ * auVar28._4_4_;
            auVar52._0_4_ = auVar106._0_4_ * auVar28._0_4_;
            auVar52._8_4_ = auVar106._8_4_ * auVar28._8_4_;
            auVar52._12_4_ = auVar106._12_4_ * auVar28._12_4_;
            auVar52._16_4_ = auVar106._16_4_ * 0.0;
            auVar52._20_4_ = auVar106._20_4_ * 0.0;
            auVar52._24_4_ = auVar106._24_4_ * 0.0;
            auVar52._28_4_ = auVar103._28_4_;
            auVar88 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar89),auVar108);
            auVar53._4_4_ = auVar108._4_4_ * auVar83._4_4_;
            auVar53._0_4_ = auVar108._0_4_ * auVar83._0_4_;
            auVar53._8_4_ = auVar108._8_4_ * auVar83._8_4_;
            auVar53._12_4_ = auVar108._12_4_ * auVar83._12_4_;
            auVar53._16_4_ = auVar108._16_4_ * 0.0;
            auVar53._20_4_ = auVar108._20_4_ * 0.0;
            auVar53._24_4_ = auVar108._24_4_ * 0.0;
            auVar53._28_4_ = auVar108._28_4_;
            auVar22 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar28),auVar91);
            auVar54._4_4_ = auVar89._4_4_ * auVar91._4_4_;
            auVar54._0_4_ = auVar89._0_4_ * auVar91._0_4_;
            auVar54._8_4_ = auVar89._8_4_ * auVar91._8_4_;
            auVar54._12_4_ = auVar89._12_4_ * auVar91._12_4_;
            auVar54._16_4_ = auVar91._16_4_ * 0.0;
            auVar54._20_4_ = auVar91._20_4_ * 0.0;
            auVar54._24_4_ = auVar91._24_4_ * 0.0;
            auVar54._28_4_ = auVar91._28_4_;
            auVar23 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar83),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar100,ZEXT1632(auVar22));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar88));
            uVar69 = vcmpps_avx512vl(auVar106,auVar100,2);
            bVar12 = (byte)uVar69;
            fVar79 = (float)((uint)(bVar12 & 1) * auVar81._0_4_ |
                            (uint)!(bool)(bVar12 & 1) * auVar90._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            fVar127 = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar90._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            fVar129 = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar90._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            fVar131 = (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar90._12_4_);
            auVar93 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar79))));
            fVar126 = (float)((uint)(bVar12 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar12 & 1) * auVar27._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            fVar128 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar27._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            fVar130 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar27._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            fVar132 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar27._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar126))));
            auVar121._0_4_ =
                 (float)((uint)(bVar12 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar12 & 1) * auVar80._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar80._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar80._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar80._12_4_);
            fVar156 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
            auVar121._16_4_ = fVar156;
            fVar140 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
            auVar121._20_4_ = fVar140;
            fVar155 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
            auVar121._24_4_ = fVar155;
            iVar1 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
            auVar121._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar102);
            auVar122._0_4_ =
                 (uint)(bVar12 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar88._0_4_;
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar88._4_4_;
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar88._8_4_;
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar88._12_4_;
            auVar122._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar106._16_4_;
            auVar122._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar106._20_4_;
            auVar122._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar106._24_4_;
            auVar122._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar21));
            auVar123._0_4_ =
                 (float)((uint)(bVar12 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar12 & 1) * auVar81._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar81._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar81._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar81._12_4_);
            fVar168 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar106._16_4_);
            auVar123._16_4_ = fVar168;
            fVar161 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar106._20_4_);
            auVar123._20_4_ = fVar161;
            fVar169 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar106._24_4_);
            auVar123._24_4_ = fVar169;
            auVar123._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar82));
            auVar124._0_4_ =
                 (float)((uint)(bVar12 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar12 & 1) * auVar20._0_4_);
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar20._4_4_);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar20._8_4_);
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar20._12_4_);
            fVar78 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar106._16_4_);
            auVar124._16_4_ = fVar78;
            fVar160 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar106._20_4_);
            auVar124._20_4_ = fVar160;
            fVar170 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar106._24_4_);
            auVar124._24_4_ = fVar170;
            iVar2 = (uint)(byte)(uVar69 >> 7) * auVar106._28_4_;
            auVar124._28_4_ = iVar2;
            auVar125._0_4_ =
                 (uint)(bVar12 & 1) * (int)auVar83._0_4_ |
                 (uint)!(bool)(bVar12 & 1) * auVar102._0_4_;
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar13 * (int)auVar83._4_4_ | (uint)!bVar13 * auVar102._4_4_;
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar13 * (int)auVar83._8_4_ | (uint)!bVar13 * auVar102._8_4_;
            bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar13 * (int)auVar83._12_4_ | (uint)!bVar13 * auVar102._12_4_;
            auVar125._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar102._16_4_;
            auVar125._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar102._20_4_;
            auVar125._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar102._24_4_;
            auVar125._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar102._28_4_;
            bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar125,auVar93);
            auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar89._12_4_ |
                                                     (uint)!bVar17 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar89._8_4_ |
                                                              (uint)!bVar15 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar89._4_4_ |
                                                                       (uint)!bVar13 * auVar21._4_4_
                                                                       ,(uint)(bVar12 & 1) *
                                                                        (int)auVar89._0_4_ |
                                                                        (uint)!(bool)(bVar12 & 1) *
                                                                        auVar21._0_4_)))),auVar96);
            auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar28._12_4_ |
                                                     (uint)!bVar18 * auVar82._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar28._8_4_ |
                                                              (uint)!bVar16 * auVar82._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar28._4_4_ |
                                                                       (uint)!bVar14 * auVar82._4_4_
                                                                       ,(uint)(bVar12 & 1) *
                                                                        (int)auVar28._0_4_ |
                                                                        (uint)!(bool)(bVar12 & 1) *
                                                                        auVar82._0_4_)))),auVar121);
            auVar103 = vsubps_avx(auVar93,auVar122);
            auVar91 = vsubps_avx(auVar96,auVar123);
            auVar92 = vsubps_avx(auVar121,auVar124);
            auVar55._4_4_ = auVar104._4_4_ * fVar127;
            auVar55._0_4_ = auVar104._0_4_ * fVar79;
            auVar55._8_4_ = auVar104._8_4_ * fVar129;
            auVar55._12_4_ = auVar104._12_4_ * fVar131;
            auVar55._16_4_ = auVar104._16_4_ * 0.0;
            auVar55._20_4_ = auVar104._20_4_ * 0.0;
            auVar55._24_4_ = auVar104._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar55,auVar121,auVar102);
            auVar159._0_4_ = fVar126 * auVar102._0_4_;
            auVar159._4_4_ = fVar128 * auVar102._4_4_;
            auVar159._8_4_ = fVar130 * auVar102._8_4_;
            auVar159._12_4_ = fVar132 * auVar102._12_4_;
            auVar159._16_4_ = auVar102._16_4_ * 0.0;
            auVar159._20_4_ = auVar102._20_4_ * 0.0;
            auVar159._24_4_ = auVar102._24_4_ * 0.0;
            auVar159._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar159,auVar93,auVar108);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar100,ZEXT1632(auVar88));
            auVar166._0_4_ = auVar108._0_4_ * auVar121._0_4_;
            auVar166._4_4_ = auVar108._4_4_ * auVar121._4_4_;
            auVar166._8_4_ = auVar108._8_4_ * auVar121._8_4_;
            auVar166._12_4_ = auVar108._12_4_ * auVar121._12_4_;
            auVar166._16_4_ = auVar108._16_4_ * fVar156;
            auVar166._20_4_ = auVar108._20_4_ * fVar140;
            auVar166._24_4_ = auVar108._24_4_ * fVar155;
            auVar166._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar166,auVar96,auVar104);
            auVar94 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar88));
            auVar106 = vmulps_avx512vl(auVar92,auVar122);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar124);
            auVar56._4_4_ = auVar91._4_4_ * auVar124._4_4_;
            auVar56._0_4_ = auVar91._0_4_ * auVar124._0_4_;
            auVar56._8_4_ = auVar91._8_4_ * auVar124._8_4_;
            auVar56._12_4_ = auVar91._12_4_ * auVar124._12_4_;
            auVar56._16_4_ = auVar91._16_4_ * fVar78;
            auVar56._20_4_ = auVar91._20_4_ * fVar160;
            auVar56._24_4_ = auVar91._24_4_ * fVar170;
            auVar56._28_4_ = iVar2;
            auVar88 = vfmsub231ps_fma(auVar56,auVar123,auVar92);
            auVar167._0_4_ = auVar123._0_4_ * auVar103._0_4_;
            auVar167._4_4_ = auVar123._4_4_ * auVar103._4_4_;
            auVar167._8_4_ = auVar123._8_4_ * auVar103._8_4_;
            auVar167._12_4_ = auVar123._12_4_ * auVar103._12_4_;
            auVar167._16_4_ = fVar168 * auVar103._16_4_;
            auVar167._20_4_ = fVar161 * auVar103._20_4_;
            auVar167._24_4_ = fVar169 * auVar103._24_4_;
            auVar167._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar167,auVar91,auVar122);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar100,auVar106);
            auVar95 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar88));
            auVar106 = vmaxps_avx(auVar94,auVar95);
            uVar134 = vcmpps_avx512vl(auVar106,auVar100,2);
            local_230 = local_230 & (byte)uVar134;
            if (local_230 == 0) {
LAB_01c0e2df:
              local_230 = 0;
            }
            else {
              auVar57._4_4_ = auVar92._4_4_ * auVar108._4_4_;
              auVar57._0_4_ = auVar92._0_4_ * auVar108._0_4_;
              auVar57._8_4_ = auVar92._8_4_ * auVar108._8_4_;
              auVar57._12_4_ = auVar92._12_4_ * auVar108._12_4_;
              auVar57._16_4_ = auVar92._16_4_ * auVar108._16_4_;
              auVar57._20_4_ = auVar92._20_4_ * auVar108._20_4_;
              auVar57._24_4_ = auVar92._24_4_ * auVar108._24_4_;
              auVar57._28_4_ = auVar106._28_4_;
              auVar20 = vfmsub231ps_fma(auVar57,auVar91,auVar104);
              auVar58._4_4_ = auVar104._4_4_ * auVar103._4_4_;
              auVar58._0_4_ = auVar104._0_4_ * auVar103._0_4_;
              auVar58._8_4_ = auVar104._8_4_ * auVar103._8_4_;
              auVar58._12_4_ = auVar104._12_4_ * auVar103._12_4_;
              auVar58._16_4_ = auVar104._16_4_ * auVar103._16_4_;
              auVar58._20_4_ = auVar104._20_4_ * auVar103._20_4_;
              auVar58._24_4_ = auVar104._24_4_ * auVar103._24_4_;
              auVar58._28_4_ = auVar104._28_4_;
              auVar81 = vfmsub231ps_fma(auVar58,auVar102,auVar92);
              auVar59._4_4_ = auVar91._4_4_ * auVar102._4_4_;
              auVar59._0_4_ = auVar91._0_4_ * auVar102._0_4_;
              auVar59._8_4_ = auVar91._8_4_ * auVar102._8_4_;
              auVar59._12_4_ = auVar91._12_4_ * auVar102._12_4_;
              auVar59._16_4_ = auVar91._16_4_ * auVar102._16_4_;
              auVar59._20_4_ = auVar91._20_4_ * auVar102._20_4_;
              auVar59._24_4_ = auVar91._24_4_ * auVar102._24_4_;
              auVar59._28_4_ = auVar91._28_4_;
              auVar21 = vfmsub231ps_fma(auVar59,auVar103,auVar108);
              auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar21));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar20),auVar100);
              auVar108 = vrcp14ps_avx512vl(auVar106);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = &DAT_3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar34._16_4_ = 0x3f800000;
              auVar34._20_4_ = 0x3f800000;
              auVar34._24_4_ = 0x3f800000;
              auVar34._28_4_ = 0x3f800000;
              auVar104 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar34);
              auVar88 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
              auVar60._4_4_ = auVar21._4_4_ * auVar121._4_4_;
              auVar60._0_4_ = auVar21._0_4_ * auVar121._0_4_;
              auVar60._8_4_ = auVar21._8_4_ * auVar121._8_4_;
              auVar60._12_4_ = auVar21._12_4_ * auVar121._12_4_;
              auVar60._16_4_ = fVar156 * 0.0;
              auVar60._20_4_ = fVar140 * 0.0;
              auVar60._24_4_ = fVar155 * 0.0;
              auVar60._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar60,auVar96,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar93,ZEXT1632(auVar20));
              fVar140 = auVar88._0_4_;
              fVar155 = auVar88._4_4_;
              fVar161 = auVar88._8_4_;
              fVar168 = auVar88._12_4_;
              auVar108 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar168,
                                            CONCAT48(auVar81._8_4_ * fVar161,
                                                     CONCAT44(auVar81._4_4_ * fVar155,
                                                              auVar81._0_4_ * fVar140))));
              auVar68._4_4_ = uStack_31c;
              auVar68._0_4_ = local_320;
              auVar68._8_4_ = uStack_318;
              auVar68._12_4_ = uStack_314;
              auVar68._16_4_ = uStack_310;
              auVar68._20_4_ = uStack_30c;
              auVar68._24_4_ = uStack_308;
              auVar68._28_4_ = uStack_304;
              uVar134 = vcmpps_avx512vl(auVar108,auVar68,0xd);
              fVar156 = ray->tfar;
              auVar35._4_4_ = fVar156;
              auVar35._0_4_ = fVar156;
              auVar35._8_4_ = fVar156;
              auVar35._12_4_ = fVar156;
              auVar35._16_4_ = fVar156;
              auVar35._20_4_ = fVar156;
              auVar35._24_4_ = fVar156;
              auVar35._28_4_ = fVar156;
              uVar24 = vcmpps_avx512vl(auVar108,auVar35,2);
              local_230 = (byte)uVar134 & (byte)uVar24 & local_230;
              if (local_230 == 0) goto LAB_01c0e2df;
              uVar134 = vcmpps_avx512vl(auVar106,auVar100,4);
              if ((local_230 & (byte)uVar134) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar134;
                fVar156 = auVar94._0_4_ * fVar140;
                fVar169 = auVar94._4_4_ * fVar155;
                auVar61._4_4_ = fVar169;
                auVar61._0_4_ = fVar156;
                fVar170 = auVar94._8_4_ * fVar161;
                auVar61._8_4_ = fVar170;
                fVar160 = auVar94._12_4_ * fVar168;
                auVar61._12_4_ = fVar160;
                fVar78 = auVar94._16_4_ * 0.0;
                auVar61._16_4_ = fVar78;
                fVar79 = auVar94._20_4_ * 0.0;
                auVar61._20_4_ = fVar79;
                fVar126 = auVar94._24_4_ * 0.0;
                auVar61._24_4_ = fVar126;
                auVar61._28_4_ = auVar94._28_4_;
                fVar140 = auVar95._0_4_ * fVar140;
                fVar155 = auVar95._4_4_ * fVar155;
                auVar62._4_4_ = fVar155;
                auVar62._0_4_ = fVar140;
                fVar161 = auVar95._8_4_ * fVar161;
                auVar62._8_4_ = fVar161;
                fVar168 = auVar95._12_4_ * fVar168;
                auVar62._12_4_ = fVar168;
                fVar127 = auVar95._16_4_ * 0.0;
                auVar62._16_4_ = fVar127;
                fVar128 = auVar95._20_4_ * 0.0;
                auVar62._20_4_ = fVar128;
                fVar129 = auVar95._24_4_ * 0.0;
                auVar62._24_4_ = fVar129;
                auVar62._28_4_ = auVar95._28_4_;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = &DAT_3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar176,auVar61);
                local_4c0._0_4_ =
                     (uint)(bVar12 & 1) * (int)fVar156 | (uint)!(bool)(bVar12 & 1) * auVar106._0_4_;
                bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
                local_4c0._4_4_ = (uint)bVar13 * (int)fVar169 | (uint)!bVar13 * auVar106._4_4_;
                bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                local_4c0._8_4_ = (uint)bVar13 * (int)fVar170 | (uint)!bVar13 * auVar106._8_4_;
                bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
                local_4c0._12_4_ = (uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar106._12_4_;
                bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
                local_4c0._16_4_ = (uint)bVar13 * (int)fVar78 | (uint)!bVar13 * auVar106._16_4_;
                bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
                local_4c0._20_4_ = (uint)bVar13 * (int)fVar79 | (uint)!bVar13 * auVar106._20_4_;
                bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
                local_4c0._24_4_ = (uint)bVar13 * (int)fVar126 | (uint)!bVar13 * auVar106._24_4_;
                bVar13 = SUB81(uVar69 >> 7,0);
                local_4c0._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar106._28_4_;
                auVar106 = vsubps_avx(auVar176,auVar62);
                bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar69 >> 6) & 1);
                bVar19 = SUB81(uVar69 >> 7,0);
                local_1c0._4_4_ = (uint)bVar13 * (int)fVar155 | (uint)!bVar13 * auVar106._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar12 & 1) * (int)fVar140 | (uint)!(bool)(bVar12 & 1) * auVar106._0_4_;
                local_1c0._8_4_ = (uint)bVar14 * (int)fVar161 | (uint)!bVar14 * auVar106._8_4_;
                local_1c0._12_4_ = (uint)bVar15 * (int)fVar168 | (uint)!bVar15 * auVar106._12_4_;
                local_1c0._16_4_ = (uint)bVar16 * (int)fVar127 | (uint)!bVar16 * auVar106._16_4_;
                local_1c0._20_4_ = (uint)bVar17 * (int)fVar128 | (uint)!bVar17 * auVar106._20_4_;
                local_1c0._24_4_ = (uint)bVar18 * (int)fVar129 | (uint)!bVar18 * auVar106._24_4_;
                local_1c0._28_4_ = (uint)bVar19 * auVar95._28_4_ | (uint)!bVar19 * auVar106._28_4_;
                local_4e0 = auVar108;
              }
            }
            auVar204 = ZEXT3264(local_560);
            auVar195 = ZEXT3264(local_540);
            if (local_230 != 0) {
              auVar106 = vsubps_avx(ZEXT1632(auVar87),auVar97);
              auVar88 = vfmadd213ps_fma(auVar106,local_4c0,auVar97);
              fVar156 = local_610->depth_scale;
              auVar36._4_4_ = fVar156;
              auVar36._0_4_ = fVar156;
              auVar36._8_4_ = fVar156;
              auVar36._12_4_ = fVar156;
              auVar36._16_4_ = fVar156;
              auVar36._20_4_ = fVar156;
              auVar36._24_4_ = fVar156;
              auVar36._28_4_ = fVar156;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                            CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                     CONCAT44(auVar88._4_4_ +
                                                                              auVar88._4_4_,
                                                                              auVar88._0_4_ +
                                                                              auVar88._0_4_)))),
                                         auVar36);
              uVar134 = vcmpps_avx512vl(local_4e0,auVar106,6);
              local_230 = local_230 & (byte)uVar134;
              if (local_230 != 0) {
                auVar139._8_4_ = 0xbf800000;
                auVar139._0_8_ = 0xbf800000bf800000;
                auVar139._12_4_ = 0xbf800000;
                auVar139._16_4_ = 0xbf800000;
                auVar139._20_4_ = 0xbf800000;
                auVar139._24_4_ = 0xbf800000;
                auVar139._28_4_ = 0xbf800000;
                auVar37._8_4_ = 0x40000000;
                auVar37._0_8_ = 0x4000000040000000;
                auVar37._12_4_ = 0x40000000;
                auVar37._16_4_ = 0x40000000;
                auVar37._20_4_ = 0x40000000;
                auVar37._24_4_ = 0x40000000;
                auVar37._28_4_ = 0x40000000;
                local_2c0 = vfmadd132ps_avx512vl(local_1c0,auVar139,auVar37);
                local_1c0 = local_2c0;
                auVar106 = local_1c0;
                local_280 = (undefined4)lVar71;
                local_270 = local_570._0_8_;
                uStack_268 = local_570._8_8_;
                local_260 = local_350._0_8_;
                uStack_258 = local_350._8_8_;
                local_250 = local_360._0_8_;
                uStack_248 = local_360._8_8_;
                local_240 = local_370._0_8_;
                uStack_238 = local_370._8_8_;
                pGVar74 = (context->scene->geometries).items[local_618].ptr;
                if ((pGVar74->mask & ray->mask) == 0) {
                  pRVar70 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar70 = context->args;
                  if ((pRVar70->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar70 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar70 >> 8),1),
                     pGVar74->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_160 = vmovdqa64_avx512vl(auVar191._0_32_);
                    auVar88 = vcvtsi2ss_avx512f(auVar196._0_16_,local_280);
                    fVar156 = auVar88._0_4_;
                    local_220[0] = (fVar156 + local_4c0._0_4_ + 0.0) * (float)local_300._0_4_;
                    local_220[1] = (fVar156 + local_4c0._4_4_ + 1.0) * (float)local_300._4_4_;
                    local_220[2] = (fVar156 + local_4c0._8_4_ + 2.0) * fStack_2f8;
                    local_220[3] = (fVar156 + local_4c0._12_4_ + 3.0) * fStack_2f4;
                    fStack_210 = (fVar156 + local_4c0._16_4_ + 4.0) * fStack_2f0;
                    fStack_20c = (fVar156 + local_4c0._20_4_ + 5.0) * fStack_2ec;
                    fStack_208 = (fVar156 + local_4c0._24_4_ + 6.0) * fStack_2e8;
                    fStack_204 = fVar156 + local_4c0._28_4_ + 7.0;
                    local_1c0._0_8_ = local_2c0._0_8_;
                    local_1c0._8_8_ = local_2c0._8_8_;
                    local_1c0._16_8_ = local_2c0._16_8_;
                    local_1c0._24_8_ = local_2c0._24_8_;
                    local_200 = local_1c0._0_8_;
                    uStack_1f8 = local_1c0._8_8_;
                    uStack_1f0 = local_1c0._16_8_;
                    uStack_1e8 = local_1c0._24_8_;
                    local_1e0 = local_4e0;
                    local_500 = local_350._0_8_;
                    uStack_4f8 = local_350._8_8_;
                    uVar69 = 0;
                    local_628 = (ulong)local_230;
                    for (uVar73 = local_628; (uVar73 & 1) == 0;
                        uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                      uVar69 = uVar69 + 1;
                    }
                    local_510 = local_360._0_4_;
                    fStack_50c = local_360._4_4_;
                    fStack_508 = local_360._8_4_;
                    fStack_504 = local_360._12_4_;
                    local_180 = local_370._0_8_;
                    uStack_178 = local_370._8_8_;
                    uVar73 = CONCAT71((int7)((ulong)pRVar70 >> 8),1);
                    local_590 = pGVar74;
                    local_2e0 = local_4c0;
                    local_2a0 = local_4e0;
                    local_27c = iVar8;
                    local_1c0 = auVar106;
                    do {
                      local_604 = (uint)uVar73;
                      local_5c4 = local_220[uVar69];
                      local_5c0 = *(undefined4 *)((long)&local_200 + uVar69 * 4);
                      local_580._0_4_ = ray->tfar;
                      ray->tfar = *(float *)(local_1e0 + uVar69 * 4);
                      local_600.context = context->user;
                      fVar140 = 1.0 - local_5c4;
                      fVar156 = fVar140 * fVar140 * -3.0;
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * fVar140)),
                                                ZEXT416((uint)(local_5c4 * fVar140)),
                                                ZEXT416(0xc0000000));
                      auVar87 = vfmsub132ss_fma(ZEXT416((uint)(local_5c4 * fVar140)),
                                                ZEXT416((uint)(local_5c4 * local_5c4)),
                                                ZEXT416(0x40000000));
                      fVar140 = auVar88._0_4_ * 3.0;
                      fVar155 = auVar87._0_4_ * 3.0;
                      fVar161 = local_5c4 * local_5c4 * 3.0;
                      auVar174._0_4_ = fVar161 * (float)local_180;
                      auVar174._4_4_ = fVar161 * local_180._4_4_;
                      auVar174._8_4_ = fVar161 * (float)uStack_178;
                      auVar174._12_4_ = fVar161 * uStack_178._4_4_;
                      auVar153._4_4_ = fVar155;
                      auVar153._0_4_ = fVar155;
                      auVar153._8_4_ = fVar155;
                      auVar153._12_4_ = fVar155;
                      auVar64._4_4_ = fStack_50c;
                      auVar64._0_4_ = local_510;
                      auVar64._8_4_ = fStack_508;
                      auVar64._12_4_ = fStack_504;
                      auVar88 = vfmadd132ps_fma(auVar153,auVar174,auVar64);
                      auVar158._4_4_ = fVar140;
                      auVar158._0_4_ = fVar140;
                      auVar158._8_4_ = fVar140;
                      auVar158._12_4_ = fVar140;
                      auVar66._8_8_ = uStack_4f8;
                      auVar66._0_8_ = local_500;
                      auVar88 = vfmadd132ps_fma(auVar158,auVar88,auVar66);
                      auVar154._4_4_ = fVar156;
                      auVar154._0_4_ = fVar156;
                      auVar154._8_4_ = fVar156;
                      auVar154._12_4_ = fVar156;
                      auVar88 = vfmadd132ps_fma(auVar154,auVar88,local_570);
                      local_5d0 = vmovlps_avx(auVar88);
                      local_5c8 = vextractps_avx(auVar88,2);
                      local_5bc = (undefined4)local_598;
                      local_5b8 = (undefined4)local_618;
                      local_5b4 = (local_600.context)->instID[0];
                      local_5b0 = (local_600.context)->instPrimID[0];
                      local_634 = -1;
                      local_600.valid = &local_634;
                      pRVar70 = (RTCIntersectArguments *)pGVar74->userPtr;
                      local_600.hit = (RTCHitN *)&local_5d0;
                      local_600.N = 1;
                      local_620 = uVar69;
                      local_600.geometryUserPtr = pRVar70;
                      local_600.ray = (RTCRayN *)ray;
                      if ((pGVar74->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar74->occlusionFilterN)(&local_600), context = local_630,
                         pGVar74 = local_590, *local_600.valid != 0)) {
                        auVar88 = auVar200._0_16_;
                        pRVar70 = context->args;
                        if (pRVar70->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar70->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar74->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar70->filter)(&local_600);
                            pGVar74 = local_590;
                          }
                          auVar88 = auVar200._0_16_;
                          context = local_630;
                          if (*local_600.valid == 0) goto LAB_01c0e26b;
                        }
                        uVar73 = (ulong)local_604;
                        break;
                      }
LAB_01c0e26b:
                      auVar88 = auVar200._0_16_;
                      ray->tfar = (float)local_580._0_4_;
                      uVar69 = 0;
                      local_628 = local_628 ^ 1L << (local_620 & 0x3f);
                      for (uVar73 = local_628; (uVar73 & 1) == 0;
                          uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        uVar69 = uVar69 + 1;
                      }
                      uVar73 = CONCAT71((int7)((ulong)pRVar70 >> 8),local_628 != 0);
                      context = local_630;
                    } while (local_628 != 0);
                    pRVar70 = (RTCIntersectArguments *)(ulong)((byte)uVar73 & 1);
                    auVar88 = vxorps_avx512vl(auVar88,auVar88);
                    auVar200 = ZEXT1664(auVar88);
                    auVar197 = ZEXT3264(local_3a0);
                    auVar198 = ZEXT3264(local_340);
                    auVar199 = ZEXT3264(local_3c0);
                    auVar195 = ZEXT3264(local_540);
                    auVar204 = ZEXT3264(local_560);
                    auVar201 = ZEXT3264(local_440);
                    auVar202 = ZEXT3264(local_460);
                    auVar203 = ZEXT3264(local_480);
                    auVar106 = vmovdqa64_avx512vl(local_160);
                    auVar191 = ZEXT3264(auVar106);
                  }
                }
                bVar76 = (bool)(bVar76 | (byte)pRVar70);
              }
            }
          }
          lVar71 = lVar71 + 8;
          auVar196 = auVar195;
        } while ((int)lVar71 < iVar8);
      }
      if (bVar76 != false) {
        return local_639;
      }
      fVar156 = ray->tfar;
      auVar30._4_4_ = fVar156;
      auVar30._0_4_ = fVar156;
      auVar30._8_4_ = fVar156;
      auVar30._12_4_ = fVar156;
      uVar134 = vcmpps_avx512vl(local_170,auVar30,2);
      uVar75 = (uint)uVar77 & (uint)uVar77 + 0xf & (uint)uVar134;
      uVar77 = (ulong)uVar75;
      local_639 = uVar75 != 0;
    } while (local_639);
  }
  return local_639;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }